

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

void embree::avx512::CurveNiIntersector1<4>::
     intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  long lVar7;
  __int_type_conflict _Var8;
  RTCFilterFunctionN p_Var9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  bool bVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar47 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  float fVar87;
  undefined4 uVar88;
  float fVar96;
  float fVar97;
  vint4 bi_2;
  float fVar98;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  vint4 bi_1;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  vint4 bi;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  vint4 ai_2;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  vint4 ai;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  vint4 ai_1;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [32];
  float fVar160;
  vfloat4 a0_3;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  __m128 a_1;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  __m128 a;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  float fVar186;
  float fVar187;
  float fVar198;
  float fVar200;
  vfloat4 a0_1;
  float fVar202;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar215;
  float fVar216;
  vfloat4 a0;
  undefined1 auVar208 [16];
  float fVar217;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 in_ZMM17 [64];
  undefined1 auVar233 [64];
  undefined1 auVar234 [64];
  undefined1 auVar235 [64];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p02;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  int local_328;
  float local_324;
  long local_320;
  Primitive *local_318;
  ulong local_310;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  RayQueryContext *local_270;
  RTCFilterFunctionNArguments local_268;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  uint auStack_198 [4];
  undefined8 local_188;
  float local_180;
  undefined8 local_17c;
  uint local_174;
  uint local_170;
  uint local_16c;
  uint local_168;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 uStack_b8;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar23;
  undefined1 auVar78 [32];
  undefined1 auVar80 [32];
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar226 [32];
  
  PVar4 = prim[1];
  uVar28 = (ulong)(byte)PVar4;
  fVar206 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar35 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  auVar53._0_4_ = fVar206 * auVar35._0_4_;
  auVar53._4_4_ = fVar206 * auVar35._4_4_;
  auVar53._8_4_ = fVar206 * auVar35._8_4_;
  auVar53._12_4_ = fVar206 * auVar35._12_4_;
  auVar51._0_4_ = fVar206 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar51._4_4_ = fVar206 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar51._8_4_ = fVar206 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar51._12_4_ = fVar206 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 4 + 6)));
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 5 + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 6 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar28 * 0xb + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6)));
  auVar44 = vcvtdq2ps_avx(auVar44);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar4 * 0xc + uVar28 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  uVar34 = (ulong)(uint)((int)(uVar28 * 9) * 2);
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + 6)));
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar34 + uVar28 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar41);
  uVar22 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar22 + 6)));
  auVar42 = vcvtdq2ps_avx(auVar42);
  auVar218._4_4_ = auVar51._0_4_;
  auVar218._0_4_ = auVar51._0_4_;
  auVar218._8_4_ = auVar51._0_4_;
  auVar218._12_4_ = auVar51._0_4_;
  auVar43 = vshufps_avx(auVar51,auVar51,0x55);
  auVar38 = vshufps_avx(auVar51,auVar51,0xaa);
  fVar206 = auVar38._0_4_;
  auVar49._0_4_ = fVar206 * auVar37._0_4_;
  fVar187 = auVar38._4_4_;
  auVar49._4_4_ = fVar187 * auVar37._4_4_;
  fVar199 = auVar38._8_4_;
  auVar49._8_4_ = fVar199 * auVar37._8_4_;
  fVar201 = auVar38._12_4_;
  auVar49._12_4_ = fVar201 * auVar37._12_4_;
  auVar99._0_4_ = auVar40._0_4_ * fVar206;
  auVar99._4_4_ = auVar40._4_4_ * fVar187;
  auVar99._8_4_ = auVar40._8_4_ * fVar199;
  auVar99._12_4_ = auVar40._12_4_ * fVar201;
  auVar50._0_4_ = auVar42._0_4_ * fVar206;
  auVar50._4_4_ = auVar42._4_4_ * fVar187;
  auVar50._8_4_ = auVar42._8_4_ * fVar199;
  auVar50._12_4_ = auVar42._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar49,auVar43,auVar36);
  auVar45 = vfmadd231ps_fma(auVar99,auVar43,auVar44);
  auVar43 = vfmadd231ps_fma(auVar50,auVar41,auVar43);
  auVar46 = vfmadd231ps_fma(auVar38,auVar218,auVar35);
  auVar45 = vfmadd231ps_fma(auVar45,auVar218,auVar47);
  auVar51 = vfmadd231ps_fma(auVar43,auVar39,auVar218);
  auVar219._4_4_ = auVar53._0_4_;
  auVar219._0_4_ = auVar53._0_4_;
  auVar219._8_4_ = auVar53._0_4_;
  auVar219._12_4_ = auVar53._0_4_;
  auVar43 = vshufps_avx(auVar53,auVar53,0x55);
  auVar38 = vshufps_avx(auVar53,auVar53,0xaa);
  fVar206 = auVar38._0_4_;
  auVar227._0_4_ = fVar206 * auVar37._0_4_;
  fVar187 = auVar38._4_4_;
  auVar227._4_4_ = fVar187 * auVar37._4_4_;
  fVar199 = auVar38._8_4_;
  auVar227._8_4_ = fVar199 * auVar37._8_4_;
  fVar201 = auVar38._12_4_;
  auVar227._12_4_ = fVar201 * auVar37._12_4_;
  auVar120._0_4_ = auVar40._0_4_ * fVar206;
  auVar120._4_4_ = auVar40._4_4_ * fVar187;
  auVar120._8_4_ = auVar40._8_4_ * fVar199;
  auVar120._12_4_ = auVar40._12_4_ * fVar201;
  auVar115._0_4_ = auVar42._0_4_ * fVar206;
  auVar115._4_4_ = auVar42._4_4_ * fVar187;
  auVar115._8_4_ = auVar42._8_4_ * fVar199;
  auVar115._12_4_ = auVar42._12_4_ * fVar201;
  auVar36 = vfmadd231ps_fma(auVar227,auVar43,auVar36);
  auVar37 = vfmadd231ps_fma(auVar120,auVar43,auVar44);
  auVar44 = vfmadd231ps_fma(auVar115,auVar43,auVar41);
  auVar40 = vfmadd231ps_fma(auVar36,auVar219,auVar35);
  auVar41 = vfmadd231ps_fma(auVar37,auVar219,auVar47);
  auVar72._16_16_ = in_YmmResult._16_16_;
  auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar35);
  auVar42 = vfmadd231ps_fma(auVar44,auVar219,auVar39);
  auVar36 = vandps_avx512vl(auVar46,auVar35);
  auVar141._8_4_ = 0x219392ef;
  auVar141._0_8_ = 0x219392ef219392ef;
  auVar141._12_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar36,auVar141,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar38._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar38._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar38._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar38._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar46._12_4_;
  auVar36 = vandps_avx512vl(auVar45,auVar35);
  uVar34 = vcmpps_avx512vl(auVar36,auVar141,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar46._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar45._12_4_;
  auVar35 = vandps_avx512vl(auVar51,auVar35);
  uVar34 = vcmpps_avx512vl(auVar35,auVar141,1);
  bVar31 = (bool)((byte)uVar34 & 1);
  auVar45._0_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._0_4_;
  bVar31 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._4_4_;
  bVar31 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._8_4_;
  bVar31 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar31 * 0x219392ef | (uint)!bVar31 * auVar51._12_4_;
  auVar35 = vrcp14ps_avx512vl(auVar38);
  auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar238 = ZEXT1664(auVar36);
  auVar37 = vfnmadd213ps_avx512vl(auVar38,auVar35,auVar36);
  auVar47 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar46);
  auVar37 = vfnmadd213ps_avx512vl(auVar46,auVar35,auVar36);
  auVar44 = vfmadd132ps_fma(auVar37,auVar35,auVar35);
  auVar35 = vrcp14ps_avx512vl(auVar45);
  auVar36 = vfnmadd213ps_avx512vl(auVar45,auVar35,auVar36);
  auVar39 = vfmadd132ps_fma(auVar36,auVar35,auVar35);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar28 * 7 + 6);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar40);
  auVar128._0_4_ = auVar47._0_4_ * auVar35._0_4_;
  auVar128._4_4_ = auVar47._4_4_ * auVar35._4_4_;
  auVar128._8_4_ = auVar47._8_4_ * auVar35._8_4_;
  auVar128._12_4_ = auVar47._12_4_ * auVar35._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar28 * 9 + 6);
  auVar35 = vpmovsxwd_avx(auVar36);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar40);
  auVar38 = vpbroadcastd_avx512vl();
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar36 = vpmovsxwd_avx(auVar37);
  auVar52._0_4_ = auVar47._0_4_ * auVar35._0_4_;
  auVar52._4_4_ = auVar47._4_4_ * auVar35._4_4_;
  auVar52._8_4_ = auVar47._8_4_ * auVar35._8_4_;
  auVar52._12_4_ = auVar47._12_4_ * auVar35._12_4_;
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar28 * -2 + 6);
  auVar35 = vpmovsxwd_avx(auVar47);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar41);
  auVar142._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar142._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar142._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar142._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar35 = vcvtdq2ps_avx(auVar36);
  auVar35 = vsubps_avx(auVar35,auVar41);
  auVar48._0_4_ = auVar44._0_4_ * auVar35._0_4_;
  auVar48._4_4_ = auVar44._4_4_ * auVar35._4_4_;
  auVar48._8_4_ = auVar44._8_4_ * auVar35._8_4_;
  auVar48._12_4_ = auVar44._12_4_ * auVar35._12_4_;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar22 + uVar28 + 6);
  auVar35 = vpmovsxwd_avx(auVar44);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar42);
  auVar121._0_4_ = auVar39._0_4_ * auVar35._0_4_;
  auVar121._4_4_ = auVar39._4_4_ * auVar35._4_4_;
  auVar121._8_4_ = auVar39._8_4_ * auVar35._8_4_;
  auVar121._12_4_ = auVar39._12_4_ * auVar35._12_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar28 * 0x17 + 6);
  auVar35 = vpmovsxwd_avx(auVar40);
  auVar35 = vcvtdq2ps_avx(auVar35);
  auVar35 = vsubps_avx(auVar35,auVar42);
  auVar54._0_4_ = auVar39._0_4_ * auVar35._0_4_;
  auVar54._4_4_ = auVar39._4_4_ * auVar35._4_4_;
  auVar54._8_4_ = auVar39._8_4_ * auVar35._8_4_;
  auVar54._12_4_ = auVar39._12_4_ * auVar35._12_4_;
  auVar35 = vpminsd_avx(auVar128,auVar52);
  auVar36 = vpminsd_avx(auVar142,auVar48);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar36 = vpminsd_avx(auVar121,auVar54);
  uVar88 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar39._4_4_ = uVar88;
  auVar39._0_4_ = uVar88;
  auVar39._8_4_ = uVar88;
  auVar39._12_4_ = uVar88;
  auVar36 = vmaxps_avx512vl(auVar36,auVar39);
  auVar35 = vmaxps_avx(auVar35,auVar36);
  auVar41._8_4_ = 0x3f7ffffa;
  auVar41._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar41._12_4_ = 0x3f7ffffa;
  local_158 = vmulps_avx512vl(auVar35,auVar41);
  auVar35 = vpmaxsd_avx(auVar128,auVar52);
  auVar36 = vpmaxsd_avx(auVar142,auVar48);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar36 = vpmaxsd_avx(auVar121,auVar54);
  fVar206 = (ray->super_RayK<1>).tfar;
  auVar42._4_4_ = fVar206;
  auVar42._0_4_ = fVar206;
  auVar42._8_4_ = fVar206;
  auVar42._12_4_ = fVar206;
  auVar36 = vminps_avx512vl(auVar36,auVar42);
  auVar35 = vminps_avx(auVar35,auVar36);
  auVar43._8_4_ = 0x3f800003;
  auVar43._0_8_ = 0x3f8000033f800003;
  auVar43._12_4_ = 0x3f800003;
  auVar35 = vmulps_avx512vl(auVar35,auVar43);
  uVar10 = vcmpps_avx512vl(local_158,auVar35,2);
  uVar34 = vpcmpgtd_avx512vl(auVar38,_DAT_01f7fcf0);
  uVar34 = ((byte)uVar10 & 0xf) & uVar34;
  if ((char)uVar34 != '\0') {
    auVar72._0_16_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar241 = ZEXT1664(auVar72._0_16_);
    auVar239 = ZEXT464(0x3f800000);
    do {
      lVar24 = 0;
      for (uVar22 = uVar34; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        lVar24 = lVar24 + 1;
      }
      uVar27 = *(uint *)(prim + 2);
      pGVar6 = (context->scene->geometries).items[uVar27].ptr;
      local_310 = (ulong)*(uint *)(prim + lVar24 * 4 + 6);
      lVar7 = *(long *)&pGVar6[1].time_range.upper;
      uVar22 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                               (ulong)*(uint *)(prim + lVar24 * 4 + 6) *
                               pGVar6[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      auVar35 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * uVar22);
      lVar24 = uVar22 + 1;
      auVar36 = *(undefined1 (*) [16])(lVar7 + (long)pGVar6[1].intersectionFilterN * lVar24);
      _Var8 = pGVar6[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar37 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * uVar22);
      auVar47 = *(undefined1 (*) [16])(_Var8 + (long)pGVar6[2].userPtr * lVar24);
      auVar70._16_16_ = auVar72._16_16_;
      auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
      auVar40 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * uVar22
                            ),auVar35,auVar39);
      auVar41 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            (pGVar6[2].intersectionFilterN + (long)pGVar6[2].pointQueryFunc * lVar24
                            ),auVar36,auVar39);
      auVar42 = vfmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + uVar22 * *(long *)&pGVar6[3].fnumTimeSegments
                            ),auVar37,auVar39);
      auVar43 = vfnmadd132ps_avx512vl
                          (*(undefined1 (*) [16])
                            ((long)pGVar6[3].userPtr + *(long *)&pGVar6[3].fnumTimeSegments * lVar24
                            ),auVar47,auVar39);
      auVar70._0_16_ = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
      auVar44 = vmulps_avx512vl(auVar36,auVar70._0_16_);
      auVar38 = vfmadd231ps_avx512vl(auVar44,auVar41,auVar70._0_16_);
      auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar40,auVar38);
      auVar100._0_4_ = auVar35._0_4_ + auVar44._0_4_;
      auVar100._4_4_ = auVar35._4_4_ + auVar44._4_4_;
      auVar100._8_4_ = auVar35._8_4_ + auVar44._8_4_;
      auVar100._12_4_ = auVar35._12_4_ + auVar44._12_4_;
      auVar51 = auVar241._0_16_;
      auVar44 = vfmadd231ps_avx512vl(auVar38,auVar40,auVar51);
      auVar38 = vfnmadd231ps_avx512vl(auVar44,auVar35,auVar51);
      auVar44 = vmulps_avx512vl(auVar47,auVar70._0_16_);
      auVar45 = vfmadd231ps_avx512vl(auVar44,auVar43,auVar70._0_16_);
      auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar42,auVar45);
      auVar208._0_4_ = auVar37._0_4_ + auVar44._0_4_;
      auVar208._4_4_ = auVar37._4_4_ + auVar44._4_4_;
      auVar208._8_4_ = auVar37._8_4_ + auVar44._8_4_;
      auVar208._12_4_ = auVar37._12_4_ + auVar44._12_4_;
      auVar44 = vfmadd231ps_avx512vl(auVar45,auVar42,auVar51);
      auVar45 = vfnmadd231ps_avx512vl(auVar44,auVar37,auVar51);
      auVar44 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar41,auVar36);
      auVar44 = vfmadd231ps_avx512vl(auVar44,auVar40,auVar70._0_16_);
      auVar46 = vfmadd231ps_avx512vl(auVar44,auVar35,auVar70._0_16_);
      auVar36 = vmulps_avx512vl(auVar36,auVar51);
      auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar51,auVar41);
      auVar36 = vfmadd231ps_avx512vl(auVar36,auVar70._0_16_,auVar40);
      auVar41 = vfnmadd231ps_avx512vl(auVar36,auVar70._0_16_,auVar35);
      auVar35 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar47);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar70._0_16_);
      auVar44 = vfmadd231ps_avx512vl(auVar35,auVar37,auVar70._0_16_);
      auVar35 = vmulps_avx512vl(auVar47,auVar51);
      auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar51,auVar43);
      auVar35 = vfmadd231ps_avx512vl(auVar35,auVar70._0_16_,auVar42);
      auVar40 = vfnmadd231ps_avx512vl(auVar35,auVar70._0_16_,auVar37);
      auVar35 = vshufps_avx(auVar38,auVar38,0xc9);
      auVar36 = vshufps_avx(auVar208,auVar208,0xc9);
      fVar87 = auVar38._0_4_;
      auVar143._0_4_ = fVar87 * auVar36._0_4_;
      fVar96 = auVar38._4_4_;
      auVar143._4_4_ = fVar96 * auVar36._4_4_;
      fVar97 = auVar38._8_4_;
      auVar143._8_4_ = fVar97 * auVar36._8_4_;
      fVar98 = auVar38._12_4_;
      auVar143._12_4_ = fVar98 * auVar36._12_4_;
      auVar36 = vfmsub231ps_fma(auVar143,auVar35,auVar208);
      auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar36 = vshufps_avx(auVar45,auVar45,0xc9);
      auVar161._0_4_ = auVar36._0_4_ * fVar87;
      auVar161._4_4_ = auVar36._4_4_ * fVar96;
      auVar161._8_4_ = auVar36._8_4_ * fVar97;
      auVar161._12_4_ = auVar36._12_4_ * fVar98;
      auVar35 = vfmsub231ps_fma(auVar161,auVar35,auVar45);
      auVar47 = vshufps_avx(auVar35,auVar35,0xc9);
      auVar35 = vshufps_avx(auVar41,auVar41,0xc9);
      auVar36 = vshufps_avx(auVar44,auVar44,0xc9);
      fVar206 = auVar41._0_4_;
      auVar169._0_4_ = auVar36._0_4_ * fVar206;
      fVar187 = auVar41._4_4_;
      auVar169._4_4_ = auVar36._4_4_ * fVar187;
      fVar199 = auVar41._8_4_;
      auVar169._8_4_ = auVar36._8_4_ * fVar199;
      fVar201 = auVar41._12_4_;
      auVar169._12_4_ = auVar36._12_4_ * fVar201;
      auVar36 = vfmsub231ps_fma(auVar169,auVar35,auVar44);
      auVar44 = vshufps_avx(auVar36,auVar36,0xc9);
      auVar36 = vshufps_avx(auVar40,auVar40,0xc9);
      auVar170._0_4_ = auVar36._0_4_ * fVar206;
      auVar170._4_4_ = auVar36._4_4_ * fVar187;
      auVar170._8_4_ = auVar36._8_4_ * fVar199;
      auVar170._12_4_ = auVar36._12_4_ * fVar201;
      auVar35 = vfmsub231ps_fma(auVar170,auVar35,auVar40);
      auVar40 = vshufps_avx(auVar35,auVar35,0xc9);
      auVar35 = vdpps_avx(auVar37,auVar37,0x7f);
      fVar203 = auVar35._0_4_;
      auVar55._4_28_ = auVar70._4_28_;
      auVar55._0_4_ = fVar203;
      auVar36 = vrsqrt14ss_avx512f(auVar70._0_16_,auVar55._0_16_);
      fVar204 = auVar36._0_4_;
      fVar205 = fVar204 * 1.5 - fVar203 * 0.5 * fVar204 * fVar204 * fVar204;
      auVar36 = vdpps_avx(auVar37,auVar47,0x7f);
      fVar207 = fVar205 * auVar37._0_4_;
      fVar215 = fVar205 * auVar37._4_4_;
      fVar216 = fVar205 * auVar37._8_4_;
      fVar217 = fVar205 * auVar37._12_4_;
      auVar162._0_4_ = fVar203 * auVar47._0_4_;
      auVar162._4_4_ = fVar203 * auVar47._4_4_;
      auVar162._8_4_ = fVar203 * auVar47._8_4_;
      auVar162._12_4_ = fVar203 * auVar47._12_4_;
      fVar203 = auVar36._0_4_;
      auVar144._0_4_ = fVar203 * auVar37._0_4_;
      auVar144._4_4_ = fVar203 * auVar37._4_4_;
      auVar144._8_4_ = fVar203 * auVar37._8_4_;
      auVar144._12_4_ = fVar203 * auVar37._12_4_;
      auVar37 = vsubps_avx(auVar162,auVar144);
      auVar36 = vrcp14ss_avx512f(auVar70._0_16_,auVar55._0_16_);
      auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
      fVar203 = auVar36._0_4_ * auVar35._0_4_;
      auVar35 = vdpps_avx(auVar44,auVar44,0x7f);
      fVar204 = auVar35._0_4_;
      auVar71._16_16_ = auVar70._16_16_;
      auVar71._0_16_ = auVar70._0_16_;
      auVar56._4_28_ = auVar71._4_28_;
      auVar56._0_4_ = fVar204;
      auVar36 = vrsqrt14ss_avx512f(auVar70._0_16_,auVar56._0_16_);
      fVar160 = auVar36._0_4_;
      fVar160 = fVar160 * 1.5 - fVar204 * 0.5 * fVar160 * fVar160 * fVar160;
      auVar36 = vdpps_avx(auVar44,auVar40,0x7f);
      fVar186 = fVar160 * auVar44._0_4_;
      fVar198 = fVar160 * auVar44._4_4_;
      fVar200 = fVar160 * auVar44._8_4_;
      fVar202 = fVar160 * auVar44._12_4_;
      auVar129._0_4_ = fVar204 * auVar40._0_4_;
      auVar129._4_4_ = fVar204 * auVar40._4_4_;
      auVar129._8_4_ = fVar204 * auVar40._8_4_;
      auVar129._12_4_ = fVar204 * auVar40._12_4_;
      fVar204 = auVar36._0_4_;
      auVar122._0_4_ = fVar204 * auVar44._0_4_;
      auVar122._4_4_ = fVar204 * auVar44._4_4_;
      auVar122._8_4_ = fVar204 * auVar44._8_4_;
      auVar122._12_4_ = fVar204 * auVar44._12_4_;
      auVar47 = vsubps_avx(auVar129,auVar122);
      auVar36 = vrcp14ss_avx512f(auVar70._0_16_,auVar56._0_16_);
      auVar35 = vfnmadd213ss_avx512f(auVar35,auVar36,ZEXT416(0x40000000));
      fVar204 = auVar36._0_4_ * auVar35._0_4_;
      auVar35 = vshufps_avx(auVar100,auVar100,0xff);
      auVar153._0_4_ = fVar207 * auVar35._0_4_;
      auVar153._4_4_ = fVar215 * auVar35._4_4_;
      auVar153._8_4_ = fVar216 * auVar35._8_4_;
      auVar153._12_4_ = fVar217 * auVar35._12_4_;
      local_1c8 = vsubps_avx(auVar100,auVar153);
      auVar36 = vshufps_avx(auVar38,auVar38,0xff);
      auVar130._0_4_ = auVar36._0_4_ * fVar207 + auVar35._0_4_ * fVar205 * fVar203 * auVar37._0_4_;
      auVar130._4_4_ = auVar36._4_4_ * fVar215 + auVar35._4_4_ * fVar205 * fVar203 * auVar37._4_4_;
      auVar130._8_4_ = auVar36._8_4_ * fVar216 + auVar35._8_4_ * fVar205 * fVar203 * auVar37._8_4_;
      auVar130._12_4_ =
           auVar36._12_4_ * fVar217 + auVar35._12_4_ * fVar205 * fVar203 * auVar37._12_4_;
      auVar37 = vsubps_avx(auVar38,auVar130);
      local_1d8._0_4_ = auVar100._0_4_ + auVar153._0_4_;
      local_1d8._4_4_ = auVar100._4_4_ + auVar153._4_4_;
      fStack_1d0 = auVar100._8_4_ + auVar153._8_4_;
      fStack_1cc = auVar100._12_4_ + auVar153._12_4_;
      auVar89._0_4_ = fVar87 + auVar130._0_4_;
      auVar89._4_4_ = fVar96 + auVar130._4_4_;
      auVar89._8_4_ = fVar97 + auVar130._8_4_;
      auVar89._12_4_ = fVar98 + auVar130._12_4_;
      auVar35 = vshufps_avx(auVar46,auVar46,0xff);
      auVar131._0_4_ = fVar186 * auVar35._0_4_;
      auVar131._4_4_ = fVar198 * auVar35._4_4_;
      auVar131._8_4_ = fVar200 * auVar35._8_4_;
      auVar131._12_4_ = fVar202 * auVar35._12_4_;
      local_1e8 = vsubps_avx(auVar46,auVar131);
      auVar36 = vshufps_avx(auVar41,auVar41,0xff);
      auVar101._0_4_ = fVar186 * auVar36._0_4_ + auVar35._0_4_ * fVar160 * auVar47._0_4_ * fVar204;
      auVar101._4_4_ = fVar198 * auVar36._4_4_ + auVar35._4_4_ * fVar160 * auVar47._4_4_ * fVar204;
      auVar101._8_4_ = fVar200 * auVar36._8_4_ + auVar35._8_4_ * fVar160 * auVar47._8_4_ * fVar204;
      auVar101._12_4_ =
           fVar202 * auVar36._12_4_ + auVar35._12_4_ * fVar160 * auVar47._12_4_ * fVar204;
      auVar35 = vsubps_avx(auVar41,auVar101);
      _local_1f8 = vaddps_avx512vl(auVar46,auVar131);
      auVar102._0_4_ = fVar206 + auVar101._0_4_;
      auVar102._4_4_ = fVar187 + auVar101._4_4_;
      auVar102._8_4_ = fVar199 + auVar101._8_4_;
      auVar102._12_4_ = fVar201 + auVar101._12_4_;
      auVar36 = vmulps_avx512vl(auVar37,auVar39);
      local_208 = vaddps_avx512vl(local_1c8,auVar36);
      auVar35 = vmulps_avx512vl(auVar35,auVar39);
      local_218 = vsubps_avx512vl(local_1e8,auVar35);
      auVar35 = vmulps_avx512vl(auVar89,auVar39);
      _local_228 = vaddps_avx512vl(_local_1d8,auVar35);
      auVar35 = vmulps_avx512vl(auVar102,auVar39);
      _local_238 = vsubps_avx512vl(_local_1f8,auVar35);
      aVar1 = (ray->super_RayK<1>).org.field_0;
      auVar36 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar103._4_4_ = uVar88;
      auVar103._0_4_ = uVar88;
      auVar103._8_4_ = uVar88;
      auVar103._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      aVar2 = (pre->ray_space).vx.field_0;
      aVar3 = (pre->ray_space).vy.field_0;
      fVar206 = (pre->ray_space).vz.field_0.m128[0];
      fVar187 = (pre->ray_space).vz.field_0.m128[1];
      fVar199 = (pre->ray_space).vz.field_0.m128[2];
      fVar201 = (pre->ray_space).vz.field_0.m128[3];
      auVar90._0_4_ = fVar206 * auVar36._0_4_;
      auVar90._4_4_ = fVar187 * auVar36._4_4_;
      auVar90._8_4_ = fVar199 * auVar36._8_4_;
      auVar90._12_4_ = fVar201 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar90,(undefined1  [16])aVar3,auVar35);
      auVar44 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar103);
      auVar36 = vsubps_avx512vl(local_208,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar107._4_4_ = uVar88;
      auVar107._0_4_ = uVar88;
      auVar107._8_4_ = uVar88;
      auVar107._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar104._0_4_ = fVar206 * auVar36._0_4_;
      auVar104._4_4_ = fVar187 * auVar36._4_4_;
      auVar104._8_4_ = fVar199 * auVar36._8_4_;
      auVar104._12_4_ = fVar201 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar3,auVar35);
      auVar40 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar107);
      auVar36 = vsubps_avx512vl(local_218,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar145._4_4_ = uVar88;
      auVar145._0_4_ = uVar88;
      auVar145._8_4_ = uVar88;
      auVar145._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar108._0_4_ = fVar206 * auVar36._0_4_;
      auVar108._4_4_ = fVar187 * auVar36._4_4_;
      auVar108._8_4_ = fVar199 * auVar36._8_4_;
      auVar108._12_4_ = fVar201 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar108,(undefined1  [16])aVar3,auVar35);
      auVar39 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar145);
      auVar36 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar163._4_4_ = uVar88;
      auVar163._0_4_ = uVar88;
      auVar163._8_4_ = uVar88;
      auVar163._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar146._0_4_ = fVar206 * auVar36._0_4_;
      auVar146._4_4_ = fVar187 * auVar36._4_4_;
      auVar146._8_4_ = fVar199 * auVar36._8_4_;
      auVar146._12_4_ = fVar201 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar146,(undefined1  [16])aVar3,auVar35);
      auVar41 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar163);
      auVar36 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar171._4_4_ = uVar88;
      auVar171._0_4_ = uVar88;
      auVar171._8_4_ = uVar88;
      auVar171._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar164._0_4_ = auVar36._0_4_ * fVar206;
      auVar164._4_4_ = auVar36._4_4_ * fVar187;
      auVar164._8_4_ = auVar36._8_4_ * fVar199;
      auVar164._12_4_ = auVar36._12_4_ * fVar201;
      auVar35 = vfmadd231ps_fma(auVar164,(undefined1  [16])aVar3,auVar35);
      auVar42 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar171);
      auVar36 = vsubps_avx512vl(_local_228,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar181._4_4_ = uVar88;
      auVar181._0_4_ = uVar88;
      auVar181._8_4_ = uVar88;
      auVar181._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar172._0_4_ = auVar36._0_4_ * fVar206;
      auVar172._4_4_ = auVar36._4_4_ * fVar187;
      auVar172._8_4_ = auVar36._8_4_ * fVar199;
      auVar172._12_4_ = auVar36._12_4_ * fVar201;
      auVar35 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar3,auVar35);
      auVar43 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar181);
      auVar36 = vsubps_avx512vl(_local_238,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar188._4_4_ = uVar88;
      auVar188._0_4_ = uVar88;
      auVar188._8_4_ = uVar88;
      auVar188._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar182._0_4_ = auVar36._0_4_ * fVar206;
      auVar182._4_4_ = auVar36._4_4_ * fVar187;
      auVar182._8_4_ = auVar36._8_4_ * fVar199;
      auVar182._12_4_ = auVar36._12_4_ * fVar201;
      auVar35 = vfmadd231ps_fma(auVar182,(undefined1  [16])aVar3,auVar35);
      auVar38 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar188);
      auVar36 = vsubps_avx512vl(_local_1f8,(undefined1  [16])aVar1);
      uVar88 = auVar36._0_4_;
      auVar189._4_4_ = uVar88;
      auVar189._0_4_ = uVar88;
      auVar189._8_4_ = uVar88;
      auVar189._12_4_ = uVar88;
      auVar35 = vshufps_avx(auVar36,auVar36,0x55);
      auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar123._0_4_ = fVar206 * auVar36._0_4_;
      auVar123._4_4_ = fVar187 * auVar36._4_4_;
      auVar123._8_4_ = fVar199 * auVar36._8_4_;
      auVar123._12_4_ = fVar201 * auVar36._12_4_;
      auVar35 = vfmadd231ps_fma(auVar123,(undefined1  [16])aVar3,auVar35);
      auVar45 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar2,auVar189);
      local_288 = vmovlhps_avx(auVar44,auVar42);
      local_298 = vmovlhps_avx512f(auVar40,auVar43);
      local_1a8 = vmovlhps_avx512f(auVar39,auVar38);
      _local_d8 = vmovlhps_avx512f(auVar41,auVar45);
      auVar35 = vminps_avx512vl(local_288,local_298);
      auVar37 = vmaxps_avx512vl(local_288,local_298);
      auVar36 = vminps_avx512vl(local_1a8,_local_d8);
      auVar36 = vminps_avx(auVar35,auVar36);
      auVar35 = vmaxps_avx512vl(local_1a8,_local_d8);
      auVar35 = vmaxps_avx(auVar37,auVar35);
      auVar37 = vshufpd_avx(auVar36,auVar36,3);
      auVar47 = vshufpd_avx(auVar35,auVar35,3);
      auVar36 = vminps_avx(auVar36,auVar37);
      auVar35 = vmaxps_avx(auVar35,auVar47);
      auVar36 = vandps_avx512vl(auVar36,auVar237._0_16_);
      auVar35 = vandps_avx512vl(auVar35,auVar237._0_16_);
      auVar35 = vmaxps_avx(auVar36,auVar35);
      auVar36 = vmovshdup_avx(auVar35);
      auVar35 = vmaxss_avx(auVar36,auVar35);
      local_320 = uVar34 + 0xf;
      fVar206 = auVar35._0_4_ * 9.536743e-07;
      local_1b8 = vmovddup_avx512vl(auVar44);
      auVar240 = ZEXT1664(local_1b8);
      local_2a8._8_8_ = auVar40._0_8_;
      local_2a8._0_8_ = auVar40._0_8_;
      local_2b8._8_8_ = auVar39._0_8_;
      local_2b8._0_8_ = auVar39._0_8_;
      local_2c8 = vmovddup_avx512vl(auVar41);
      register0x00001348 = auVar42._0_8_;
      local_2d8 = auVar42._0_8_;
      register0x00001388 = auVar43._0_8_;
      local_2e8 = auVar43._0_8_;
      register0x00001408 = auVar38._0_8_;
      local_2f8 = auVar38._0_8_;
      register0x00001448 = auVar45._0_8_;
      local_308 = auVar45._0_8_;
      local_c8 = ZEXT416((uint)fVar206);
      auVar91._4_4_ = fVar206;
      auVar91._0_4_ = fVar206;
      auVar91._8_4_ = fVar206;
      auVar91._12_4_ = fVar206;
      local_78._16_4_ = fVar206;
      local_78._0_16_ = auVar91;
      local_78._20_4_ = fVar206;
      local_78._24_4_ = fVar206;
      local_78._28_4_ = fVar206;
      auVar12._8_4_ = 0x80000000;
      auVar12._0_8_ = 0x8000000080000000;
      auVar12._12_4_ = 0x80000000;
      auVar35 = vxorps_avx512vl(auVar91,auVar12);
      local_98 = auVar35._0_4_;
      uStack_94 = local_98;
      uStack_90 = local_98;
      uStack_8c = local_98;
      uStack_88 = local_98;
      uStack_84 = local_98;
      uStack_80 = local_98;
      uStack_7c = local_98;
      local_e8 = vsubps_avx512vl(local_298,local_288);
      local_f8 = vsubps_avx512vl(local_1a8,local_298);
      local_108 = vsubps_avx512vl(_local_d8,local_1a8);
      local_118 = vsubps_avx(_local_1d8,local_1c8);
      local_128 = vsubps_avx512vl(_local_228,local_208);
      local_138 = vsubps_avx512vl(_local_238,local_218);
      _local_148 = vsubps_avx512vl(_local_1f8,local_1e8);
      uVar22 = 0;
      auVar35 = ZEXT816(0x3f80000000000000);
      local_318 = prim;
      auVar105 = auVar35;
LAB_01aa72c8:
      auVar36 = vshufps_avx(auVar105,auVar105,0x50);
      auVar223._8_4_ = 0x3f800000;
      auVar223._0_8_ = 0x3f8000003f800000;
      auVar223._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._0_16_ = auVar223;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar37 = vsubps_avx(auVar223,auVar36);
      fVar206 = auVar36._0_4_;
      auVar124._0_4_ = local_2d8._0_4_ * fVar206;
      fVar187 = auVar36._4_4_;
      auVar124._4_4_ = local_2d8._4_4_ * fVar187;
      fVar199 = auVar36._8_4_;
      auVar124._8_4_ = local_2d8._8_4_ * fVar199;
      fVar201 = auVar36._12_4_;
      auVar124._12_4_ = local_2d8._12_4_ * fVar201;
      auVar132._0_4_ = local_2e8._0_4_ * fVar206;
      auVar132._4_4_ = local_2e8._4_4_ * fVar187;
      auVar132._8_4_ = local_2e8._8_4_ * fVar199;
      auVar132._12_4_ = local_2e8._12_4_ * fVar201;
      auVar147._0_4_ = local_2f8._0_4_ * fVar206;
      auVar147._4_4_ = local_2f8._4_4_ * fVar187;
      auVar147._8_4_ = local_2f8._8_4_ * fVar199;
      auVar147._12_4_ = local_2f8._12_4_ * fVar201;
      auVar109._0_4_ = local_308._0_4_ * fVar206;
      auVar109._4_4_ = local_308._4_4_ * fVar187;
      auVar109._8_4_ = local_308._8_4_ * fVar199;
      auVar109._12_4_ = local_308._12_4_ * fVar201;
      auVar40 = vfmadd231ps_avx512vl(auVar124,auVar37,auVar240._0_16_);
      auVar47 = vfmadd231ps_fma(auVar132,auVar37,local_2a8);
      auVar44 = vfmadd231ps_fma(auVar147,auVar37,local_2b8);
      auVar37 = vfmadd231ps_avx512vl(auVar109,local_2c8,auVar37);
      auVar36 = vmovshdup_avx(auVar35);
      fVar187 = auVar35._0_4_;
      fVar206 = (auVar36._0_4_ - fVar187) * 0.04761905;
      auVar69._4_4_ = fVar187;
      auVar69._0_4_ = fVar187;
      auVar69._8_4_ = fVar187;
      auVar69._12_4_ = fVar187;
      auVar69._16_4_ = fVar187;
      auVar69._20_4_ = fVar187;
      auVar69._24_4_ = fVar187;
      auVar69._28_4_ = fVar187;
      auVar64._0_8_ = auVar36._0_8_;
      auVar64._8_8_ = auVar64._0_8_;
      auVar64._16_8_ = auVar64._0_8_;
      auVar64._24_8_ = auVar64._0_8_;
      auVar72 = vsubps_avx(auVar64,auVar69);
      uVar88 = auVar40._0_4_;
      auVar74._4_4_ = uVar88;
      auVar74._0_4_ = uVar88;
      auVar74._8_4_ = uVar88;
      auVar74._12_4_ = uVar88;
      auVar74._16_4_ = uVar88;
      auVar74._20_4_ = uVar88;
      auVar74._24_4_ = uVar88;
      auVar74._28_4_ = uVar88;
      auVar127._8_4_ = 1;
      auVar127._0_8_ = 0x100000001;
      auVar127._12_4_ = 1;
      auVar127._16_4_ = 1;
      auVar127._20_4_ = 1;
      auVar127._24_4_ = 1;
      auVar127._28_4_ = 1;
      auVar71 = ZEXT1632(auVar40);
      auVar70 = vpermps_avx2(auVar127,auVar71);
      auVar55 = vbroadcastss_avx512vl(auVar47);
      auVar65 = ZEXT1632(auVar47);
      auVar56 = vpermps_avx512vl(auVar127,auVar65);
      auVar57 = vbroadcastss_avx512vl(auVar44);
      auVar66 = ZEXT1632(auVar44);
      auVar58 = vpermps_avx512vl(auVar127,auVar66);
      auVar59 = vbroadcastss_avx512vl(auVar37);
      auVar68 = ZEXT1632(auVar37);
      auVar60 = vpermps_avx512vl(auVar127,auVar68);
      auVar139._4_4_ = fVar206;
      auVar139._0_4_ = fVar206;
      auVar139._8_4_ = fVar206;
      auVar139._12_4_ = fVar206;
      auVar139._16_4_ = fVar206;
      auVar139._20_4_ = fVar206;
      auVar139._24_4_ = fVar206;
      auVar139._28_4_ = fVar206;
      auVar67._8_4_ = 2;
      auVar67._0_8_ = 0x200000002;
      auVar67._12_4_ = 2;
      auVar67._16_4_ = 2;
      auVar67._20_4_ = 2;
      auVar67._24_4_ = 2;
      auVar67._28_4_ = 2;
      auVar61 = vpermps_avx512vl(auVar67,auVar71);
      auVar62 = vbroadcastss_avx512vl(ZEXT416(3));
      auVar63 = vpermps_avx512vl(auVar62,auVar71);
      auVar64 = vpermps_avx512vl(auVar67,auVar65);
      auVar65 = vpermps_avx512vl(auVar62,auVar65);
      auVar71 = vpermps_avx2(auVar67,auVar66);
      auVar66 = vpermps_avx512vl(auVar62,auVar66);
      auVar67 = vpermps_avx512vl(auVar67,auVar68);
      auVar68 = vpermps_avx512vl(auVar62,auVar68);
      auVar36 = vfmadd132ps_fma(auVar72,auVar69,_DAT_01faff20);
      auVar72 = vsubps_avx(auVar226,ZEXT1632(auVar36));
      auVar62 = vmulps_avx512vl(auVar55,ZEXT1632(auVar36));
      auVar73 = ZEXT1632(auVar36);
      auVar69 = vmulps_avx512vl(auVar56,auVar73);
      auVar37 = vfmadd231ps_fma(auVar62,auVar72,auVar74);
      auVar47 = vfmadd231ps_fma(auVar69,auVar72,auVar70);
      auVar62 = vmulps_avx512vl(auVar57,auVar73);
      auVar69 = vmulps_avx512vl(auVar58,auVar73);
      auVar55 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar55);
      auVar56 = vfmadd231ps_avx512vl(auVar69,auVar72,auVar56);
      auVar62 = vmulps_avx512vl(auVar59,auVar73);
      auVar74 = ZEXT1632(auVar36);
      auVar60 = vmulps_avx512vl(auVar60,auVar74);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar57);
      auVar69 = vfmadd231ps_avx512vl(auVar60,auVar72,auVar58);
      fVar199 = auVar36._0_4_;
      fVar201 = auVar36._4_4_;
      auVar57._4_4_ = fVar201 * auVar55._4_4_;
      auVar57._0_4_ = fVar199 * auVar55._0_4_;
      fVar203 = auVar36._8_4_;
      auVar57._8_4_ = fVar203 * auVar55._8_4_;
      fVar204 = auVar36._12_4_;
      auVar57._12_4_ = fVar204 * auVar55._12_4_;
      auVar57._16_4_ = auVar55._16_4_ * 0.0;
      auVar57._20_4_ = auVar55._20_4_ * 0.0;
      auVar57._24_4_ = auVar55._24_4_ * 0.0;
      auVar57._28_4_ = fVar187;
      auVar58._4_4_ = fVar201 * auVar56._4_4_;
      auVar58._0_4_ = fVar199 * auVar56._0_4_;
      auVar58._8_4_ = fVar203 * auVar56._8_4_;
      auVar58._12_4_ = fVar204 * auVar56._12_4_;
      auVar58._16_4_ = auVar56._16_4_ * 0.0;
      auVar58._20_4_ = auVar56._20_4_ * 0.0;
      auVar58._24_4_ = auVar56._24_4_ * 0.0;
      auVar58._28_4_ = auVar70._28_4_;
      auVar37 = vfmadd231ps_fma(auVar57,auVar72,ZEXT1632(auVar37));
      auVar47 = vfmadd231ps_fma(auVar58,auVar72,ZEXT1632(auVar47));
      auVar73._0_4_ = fVar199 * auVar62._0_4_;
      auVar73._4_4_ = fVar201 * auVar62._4_4_;
      auVar73._8_4_ = fVar203 * auVar62._8_4_;
      auVar73._12_4_ = fVar204 * auVar62._12_4_;
      auVar73._16_4_ = auVar62._16_4_ * 0.0;
      auVar73._20_4_ = auVar62._20_4_ * 0.0;
      auVar73._24_4_ = auVar62._24_4_ * 0.0;
      auVar73._28_4_ = 0;
      auVar60._4_4_ = fVar201 * auVar69._4_4_;
      auVar60._0_4_ = fVar199 * auVar69._0_4_;
      auVar60._8_4_ = fVar203 * auVar69._8_4_;
      auVar60._12_4_ = fVar204 * auVar69._12_4_;
      auVar60._16_4_ = auVar69._16_4_ * 0.0;
      auVar60._20_4_ = auVar69._20_4_ * 0.0;
      auVar60._24_4_ = auVar69._24_4_ * 0.0;
      auVar60._28_4_ = auVar62._28_4_;
      auVar44 = vfmadd231ps_fma(auVar73,auVar72,auVar55);
      auVar40 = vfmadd231ps_fma(auVar60,auVar72,auVar56);
      auVar62._28_4_ = auVar56._28_4_;
      auVar62._0_28_ =
           ZEXT1628(CONCAT412(fVar204 * auVar40._12_4_,
                              CONCAT48(fVar203 * auVar40._8_4_,
                                       CONCAT44(fVar201 * auVar40._4_4_,fVar199 * auVar40._0_4_))));
      auVar39 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar204 * auVar44._12_4_,
                                                   CONCAT48(fVar203 * auVar44._8_4_,
                                                            CONCAT44(fVar201 * auVar44._4_4_,
                                                                     fVar199 * auVar44._0_4_)))),
                                auVar72,ZEXT1632(auVar37));
      auVar41 = vfmadd231ps_fma(auVar62,auVar72,ZEXT1632(auVar47));
      auVar70 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar37));
      auVar55 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar47));
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar70 = vmulps_avx512vl(auVar70,auVar56);
      auVar55 = vmulps_avx512vl(auVar55,auVar56);
      auVar75._0_4_ = fVar206 * auVar70._0_4_;
      auVar75._4_4_ = fVar206 * auVar70._4_4_;
      auVar75._8_4_ = fVar206 * auVar70._8_4_;
      auVar75._12_4_ = fVar206 * auVar70._12_4_;
      auVar75._16_4_ = fVar206 * auVar70._16_4_;
      auVar75._20_4_ = fVar206 * auVar70._20_4_;
      auVar75._24_4_ = fVar206 * auVar70._24_4_;
      auVar75._28_4_ = 0;
      auVar70 = vmulps_avx512vl(auVar139,auVar55);
      auVar47 = vxorps_avx512vl(auVar59._0_16_,auVar59._0_16_);
      auVar55 = vpermt2ps_avx512vl(ZEXT1632(auVar39),_DAT_01feed00,ZEXT1632(auVar47));
      auVar57 = vpermt2ps_avx512vl(ZEXT1632(auVar41),_DAT_01feed00,ZEXT1632(auVar47));
      auVar114._0_4_ = auVar75._0_4_ + auVar39._0_4_;
      auVar114._4_4_ = auVar75._4_4_ + auVar39._4_4_;
      auVar114._8_4_ = auVar75._8_4_ + auVar39._8_4_;
      auVar114._12_4_ = auVar75._12_4_ + auVar39._12_4_;
      auVar114._16_4_ = auVar75._16_4_ + 0.0;
      auVar114._20_4_ = auVar75._20_4_ + 0.0;
      auVar114._24_4_ = auVar75._24_4_ + 0.0;
      auVar114._28_4_ = 0;
      auVar69 = ZEXT1632(auVar47);
      auVar58 = vpermt2ps_avx512vl(auVar75,_DAT_01feed00,auVar69);
      auVar60 = vaddps_avx512vl(ZEXT1632(auVar41),auVar70);
      auVar62 = vpermt2ps_avx512vl(auVar70,_DAT_01feed00,auVar69);
      auVar70 = vsubps_avx(auVar55,auVar58);
      auVar58 = vsubps_avx512vl(auVar57,auVar62);
      auVar62 = vmulps_avx512vl(auVar64,auVar74);
      auVar59 = vmulps_avx512vl(auVar65,auVar74);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar72,auVar61);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar72,auVar63);
      auVar61 = vmulps_avx512vl(auVar71,auVar74);
      auVar63 = vmulps_avx512vl(auVar66,auVar74);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar72,auVar64);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar72,auVar65);
      auVar64 = vmulps_avx512vl(auVar67,auVar74);
      auVar65 = vmulps_avx512vl(auVar68,auVar74);
      auVar37 = vfmadd231ps_fma(auVar64,auVar72,auVar71);
      auVar71 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar66);
      auVar64 = vmulps_avx512vl(auVar74,auVar61);
      auVar67 = ZEXT1632(auVar36);
      auVar65 = vmulps_avx512vl(auVar67,auVar63);
      auVar62 = vfmadd231ps_avx512vl(auVar64,auVar72,auVar62);
      auVar64 = vfmadd231ps_avx512vl(auVar65,auVar72,auVar59);
      auVar71 = vmulps_avx512vl(auVar67,auVar71);
      auVar61 = vfmadd231ps_avx512vl
                          (ZEXT1632(CONCAT412(fVar204 * auVar37._12_4_,
                                              CONCAT48(fVar203 * auVar37._8_4_,
                                                       CONCAT44(fVar201 * auVar37._4_4_,
                                                                fVar199 * auVar37._0_4_)))),auVar72,
                           auVar61);
      auVar71 = vfmadd231ps_avx512vl(auVar71,auVar72,auVar63);
      auVar59._4_4_ = fVar201 * auVar61._4_4_;
      auVar59._0_4_ = fVar199 * auVar61._0_4_;
      auVar59._8_4_ = fVar203 * auVar61._8_4_;
      auVar59._12_4_ = fVar204 * auVar61._12_4_;
      auVar59._16_4_ = auVar61._16_4_ * 0.0;
      auVar59._20_4_ = auVar61._20_4_ * 0.0;
      auVar59._24_4_ = auVar61._24_4_ * 0.0;
      auVar59._28_4_ = auVar66._28_4_;
      auVar63 = vmulps_avx512vl(auVar67,auVar71);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar72,auVar62);
      auVar65 = vfmadd231ps_avx512vl(auVar63,auVar64,auVar72);
      auVar72 = vsubps_avx512vl(auVar61,auVar62);
      auVar71 = vsubps_avx512vl(auVar71,auVar64);
      auVar72 = vmulps_avx512vl(auVar72,auVar56);
      auVar71 = vmulps_avx512vl(auVar71,auVar56);
      fVar187 = fVar206 * auVar72._0_4_;
      fVar199 = fVar206 * auVar72._4_4_;
      auVar61._4_4_ = fVar199;
      auVar61._0_4_ = fVar187;
      fVar201 = fVar206 * auVar72._8_4_;
      auVar61._8_4_ = fVar201;
      fVar203 = fVar206 * auVar72._12_4_;
      auVar61._12_4_ = fVar203;
      fVar204 = fVar206 * auVar72._16_4_;
      auVar61._16_4_ = fVar204;
      fVar205 = fVar206 * auVar72._20_4_;
      auVar61._20_4_ = fVar205;
      fVar206 = fVar206 * auVar72._24_4_;
      auVar61._24_4_ = fVar206;
      auVar61._28_4_ = auVar72._28_4_;
      auVar71 = vmulps_avx512vl(auVar139,auVar71);
      auVar56 = vpermt2ps_avx512vl(auVar59,_DAT_01feed00,auVar69);
      auVar62 = vpermt2ps_avx512vl(auVar65,_DAT_01feed00,auVar69);
      auVar185._0_4_ = auVar59._0_4_ + fVar187;
      auVar185._4_4_ = auVar59._4_4_ + fVar199;
      auVar185._8_4_ = auVar59._8_4_ + fVar201;
      auVar185._12_4_ = auVar59._12_4_ + fVar203;
      auVar185._16_4_ = auVar59._16_4_ + fVar204;
      auVar185._20_4_ = auVar59._20_4_ + fVar205;
      auVar185._24_4_ = auVar59._24_4_ + fVar206;
      auVar185._28_4_ = auVar59._28_4_ + auVar72._28_4_;
      auVar72 = vpermt2ps_avx512vl(auVar61,_DAT_01feed00,ZEXT1632(auVar47));
      auVar61 = vaddps_avx512vl(auVar65,auVar71);
      auVar71 = vpermt2ps_avx512vl(auVar71,_DAT_01feed00,ZEXT1632(auVar47));
      auVar72 = vsubps_avx(auVar56,auVar72);
      auVar71 = vsubps_avx512vl(auVar62,auVar71);
      in_ZMM17 = ZEXT3264(auVar71);
      auVar127 = ZEXT1632(auVar39);
      auVar63 = vsubps_avx512vl(auVar59,auVar127);
      auVar139 = ZEXT1632(auVar41);
      auVar64 = vsubps_avx512vl(auVar65,auVar139);
      auVar66 = vsubps_avx512vl(auVar56,auVar55);
      auVar63 = vaddps_avx512vl(auVar63,auVar66);
      auVar66 = vsubps_avx512vl(auVar62,auVar57);
      auVar64 = vaddps_avx512vl(auVar64,auVar66);
      auVar66 = vmulps_avx512vl(auVar139,auVar63);
      auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar127,auVar64);
      auVar67 = vmulps_avx512vl(auVar60,auVar63);
      auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar114,auVar64);
      auVar68 = vmulps_avx512vl(auVar58,auVar63);
      auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar70,auVar64);
      auVar69 = vmulps_avx512vl(auVar57,auVar63);
      auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar55,auVar64);
      auVar73 = vmulps_avx512vl(auVar65,auVar63);
      auVar73 = vfnmadd231ps_avx512vl(auVar73,auVar59,auVar64);
      auVar74 = vmulps_avx512vl(auVar61,auVar63);
      auVar74 = vfnmadd231ps_avx512vl(auVar74,auVar185,auVar64);
      auVar75 = vmulps_avx512vl(auVar71,auVar63);
      auVar75 = vfnmadd231ps_avx512vl(auVar75,auVar72,auVar64);
      auVar63 = vmulps_avx512vl(auVar62,auVar63);
      auVar63 = vfnmadd231ps_avx512vl(auVar63,auVar56,auVar64);
      auVar64 = vminps_avx512vl(auVar66,auVar67);
      auVar66 = vmaxps_avx512vl(auVar66,auVar67);
      auVar67 = vminps_avx512vl(auVar68,auVar69);
      auVar64 = vminps_avx512vl(auVar64,auVar67);
      auVar67 = vmaxps_avx512vl(auVar68,auVar69);
      auVar66 = vmaxps_avx512vl(auVar66,auVar67);
      auVar67 = vminps_avx512vl(auVar73,auVar74);
      auVar68 = vmaxps_avx512vl(auVar73,auVar74);
      auVar69 = vminps_avx512vl(auVar75,auVar63);
      auVar67 = vminps_avx512vl(auVar67,auVar69);
      auVar64 = vminps_avx512vl(auVar64,auVar67);
      auVar63 = vmaxps_avx512vl(auVar75,auVar63);
      auVar63 = vmaxps_avx512vl(auVar68,auVar63);
      auVar66 = vmaxps_avx512vl(auVar66,auVar63);
      auVar233 = ZEXT3264(auVar66);
      uVar10 = vcmpps_avx512vl(auVar64,local_78,2);
      auVar63._4_4_ = uStack_94;
      auVar63._0_4_ = local_98;
      auVar63._8_4_ = uStack_90;
      auVar63._12_4_ = uStack_8c;
      auVar63._16_4_ = uStack_88;
      auVar63._20_4_ = uStack_84;
      auVar63._24_4_ = uStack_80;
      auVar63._28_4_ = uStack_7c;
      uVar11 = vcmpps_avx512vl(auVar66,auVar63,5);
      bVar20 = (byte)uVar10 & (byte)uVar11 & 0x7f;
      if (bVar20 != 0) {
        auVar64 = vsubps_avx512vl(auVar55,auVar127);
        auVar66 = vsubps_avx512vl(auVar57,auVar139);
        auVar67 = vsubps_avx512vl(auVar56,auVar59);
        auVar64 = vaddps_avx512vl(auVar64,auVar67);
        auVar233 = ZEXT3264(auVar64);
        auVar67 = vsubps_avx512vl(auVar62,auVar65);
        auVar66 = vaddps_avx512vl(auVar66,auVar67);
        auVar67 = vmulps_avx512vl(auVar139,auVar64);
        auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar66,auVar127);
        auVar60 = vmulps_avx512vl(auVar60,auVar64);
        auVar60 = vfnmadd213ps_avx512vl(auVar114,auVar66,auVar60);
        auVar58 = vmulps_avx512vl(auVar58,auVar64);
        auVar58 = vfnmadd213ps_avx512vl(auVar70,auVar66,auVar58);
        auVar70 = vmulps_avx512vl(auVar57,auVar64);
        auVar57 = vfnmadd231ps_avx512vl(auVar70,auVar66,auVar55);
        auVar70 = vmulps_avx512vl(auVar65,auVar64);
        auVar59 = vfnmadd231ps_avx512vl(auVar70,auVar66,auVar59);
        auVar70 = vmulps_avx512vl(auVar61,auVar64);
        auVar61 = vfnmadd213ps_avx512vl(auVar185,auVar66,auVar70);
        auVar70 = vmulps_avx512vl(auVar71,auVar64);
        auVar65 = vfnmadd213ps_avx512vl(auVar72,auVar66,auVar70);
        auVar72 = vmulps_avx512vl(auVar62,auVar64);
        auVar62 = vfnmadd231ps_avx512vl(auVar72,auVar56,auVar66);
        auVar70 = vminps_avx(auVar67,auVar60);
        auVar72 = vmaxps_avx(auVar67,auVar60);
        auVar55 = vminps_avx(auVar58,auVar57);
        auVar55 = vminps_avx(auVar70,auVar55);
        auVar70 = vmaxps_avx(auVar58,auVar57);
        auVar72 = vmaxps_avx(auVar72,auVar70);
        auVar71 = vminps_avx(auVar59,auVar61);
        auVar70 = vmaxps_avx(auVar59,auVar61);
        auVar56 = vminps_avx(auVar65,auVar62);
        auVar71 = vminps_avx(auVar71,auVar56);
        auVar71 = vminps_avx(auVar55,auVar71);
        auVar55 = vmaxps_avx(auVar65,auVar62);
        auVar70 = vmaxps_avx(auVar70,auVar55);
        auVar72 = vmaxps_avx(auVar72,auVar70);
        uVar10 = vcmpps_avx512vl(auVar72,auVar63,5);
        uVar11 = vcmpps_avx512vl(auVar71,local_78,2);
        bVar20 = bVar20 & (byte)uVar10 & (byte)uVar11;
        if (bVar20 != 0) {
          auStack_198[uVar22] = (uint)bVar20;
          uVar10 = vmovlps_avx(auVar35);
          (&uStack_b8)[uVar22] = uVar10;
          uVar28 = vmovlps_avx(auVar105);
          auStack_58[uVar22] = uVar28;
          uVar22 = (ulong)((int)uVar22 + 1);
        }
      }
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
      auVar234 = ZEXT3264(auVar72);
      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
      auVar235 = ZEXT1664(auVar35);
      auVar236 = ZEXT3264(_DAT_01feed20);
      auVar72 = _DAT_01feed20;
      if ((int)uVar22 != 0) {
        do {
          auVar37 = auVar238._0_16_;
          auVar44 = auVar241._0_16_;
          auVar36 = SUB6416(ZEXT464(0xb8d1b717),0);
          auVar47 = auVar240._0_16_;
          uVar21 = (int)uVar22 - 1;
          uVar23 = (ulong)uVar21;
          uVar5 = auStack_198[uVar23];
          auVar105._8_8_ = 0;
          auVar105._0_8_ = auStack_58[uVar23];
          uVar28 = 0;
          for (uVar26 = (ulong)uVar5; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000)
          {
            uVar28 = uVar28 + 1;
          }
          uVar25 = uVar5 - 1 & uVar5;
          bVar31 = uVar25 == 0;
          auStack_198[uVar23] = uVar25;
          if (bVar31) {
            uVar22 = (ulong)uVar21;
          }
          auVar92._8_8_ = 0;
          auVar92._0_8_ = uVar28;
          auVar35 = vpunpcklqdq_avx(auVar92,ZEXT416((int)uVar28 + 1));
          auVar35 = vcvtqq2ps_avx512vl(auVar35);
          auVar35 = vmulps_avx512vl(auVar35,auVar235._0_16_);
          uVar88 = *(undefined4 *)((long)&uStack_b8 + uVar23 * 8 + 4);
          auVar13._4_4_ = uVar88;
          auVar13._0_4_ = uVar88;
          auVar13._8_4_ = uVar88;
          auVar13._12_4_ = uVar88;
          auVar40 = vmulps_avx512vl(auVar35,auVar13);
          auVar35 = vsubps_avx512vl(auVar37,auVar35);
          uVar88 = *(undefined4 *)(&uStack_b8 + uVar23);
          auVar14._4_4_ = uVar88;
          auVar14._0_4_ = uVar88;
          auVar14._8_4_ = uVar88;
          auVar14._12_4_ = uVar88;
          auVar35 = vfmadd231ps_avx512vl(auVar40,auVar35,auVar14);
          auVar40 = vmovshdup_avx(auVar35);
          fVar206 = auVar40._0_4_ - auVar35._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar206));
          if (uVar5 == 0 || bVar31) goto LAB_01aa72c8;
          auVar40 = vshufps_avx(auVar105,auVar105,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar206));
          uVar21 = (uint)uVar22;
          bVar29 = uVar21 < 4;
          bVar32 = uVar21 - 4 == 0;
          bVar30 = (POPCOUNT(uVar21 - 4 & 0xff) & 1U) == 0;
          auVar41 = vsubps_avx512vl(auVar37,auVar40);
          fVar187 = auVar40._0_4_;
          auVar133._0_4_ = fVar187 * (float)local_2d8._0_4_;
          fVar199 = auVar40._4_4_;
          auVar133._4_4_ = fVar199 * (float)local_2d8._4_4_;
          fVar201 = auVar40._8_4_;
          auVar133._8_4_ = fVar201 * fStack_2d0;
          fVar203 = auVar40._12_4_;
          auVar133._12_4_ = fVar203 * fStack_2cc;
          auVar148._0_4_ = fVar187 * (float)local_2e8._0_4_;
          auVar148._4_4_ = fVar199 * (float)local_2e8._4_4_;
          auVar148._8_4_ = fVar201 * fStack_2e0;
          auVar148._12_4_ = fVar203 * fStack_2dc;
          auVar154._0_4_ = fVar187 * (float)local_2f8._0_4_;
          auVar154._4_4_ = fVar199 * (float)local_2f8._4_4_;
          auVar154._8_4_ = fVar201 * fStack_2f0;
          auVar154._12_4_ = fVar203 * fStack_2ec;
          auVar116._0_4_ = fVar187 * (float)local_308._0_4_;
          auVar116._4_4_ = fVar199 * (float)local_308._4_4_;
          auVar116._8_4_ = fVar201 * fStack_300;
          auVar116._12_4_ = fVar203 * fStack_2fc;
          auVar42 = vfmadd231ps_avx512vl(auVar133,auVar41,auVar47);
          auVar40 = vfmadd231ps_fma(auVar148,auVar41,local_2a8);
          auVar39 = vfmadd231ps_fma(auVar154,auVar41,local_2b8);
          auVar41 = vfmadd231ps_fma(auVar116,auVar41,local_2c8);
          auVar66._16_16_ = auVar42;
          auVar66._0_16_ = auVar42;
          auVar68._16_16_ = auVar40;
          auVar68._0_16_ = auVar40;
          auVar152._16_16_ = auVar39;
          auVar152._0_16_ = auVar39;
          auVar70 = vpermps_avx512vl(auVar236._0_32_,ZEXT1632(auVar35));
          auVar72 = vsubps_avx(auVar68,auVar66);
          auVar42 = vfmadd213ps_fma(auVar72,auVar70,auVar66);
          auVar72 = vsubps_avx(auVar152,auVar68);
          auVar43 = vfmadd213ps_fma(auVar72,auVar70,auVar68);
          auVar40 = vsubps_avx(auVar41,auVar39);
          auVar140._16_16_ = auVar40;
          auVar140._0_16_ = auVar40;
          auVar40 = vfmadd213ps_fma(auVar140,auVar70,auVar152);
          auVar72 = vsubps_avx(ZEXT1632(auVar43),ZEXT1632(auVar42));
          auVar39 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar42));
          auVar72 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar43));
          auVar40 = vfmadd213ps_fma(auVar72,auVar70,ZEXT1632(auVar43));
          auVar72 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar39));
          auVar99 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar72,auVar70);
          auVar72 = vmulps_avx512vl(auVar72,auVar234._0_32_);
          auVar65._16_16_ = auVar72._16_16_;
          auVar40 = vmulss_avx512f(ZEXT416((uint)fVar206),SUB6416(ZEXT464(0x3eaaaaab),0));
          fVar187 = auVar40._0_4_;
          auVar155._0_8_ =
               CONCAT44(auVar99._4_4_ + fVar187 * auVar72._4_4_,
                        auVar99._0_4_ + fVar187 * auVar72._0_4_);
          auVar155._8_4_ = auVar99._8_4_ + fVar187 * auVar72._8_4_;
          auVar155._12_4_ = auVar99._12_4_ + fVar187 * auVar72._12_4_;
          auVar134._0_4_ = fVar187 * auVar72._16_4_;
          auVar134._4_4_ = fVar187 * auVar72._20_4_;
          auVar134._8_4_ = fVar187 * auVar72._24_4_;
          auVar134._12_4_ = fVar187 * auVar72._28_4_;
          auVar51 = vsubps_avx((undefined1  [16])0x0,auVar134);
          auVar43 = vshufpd_avx(auVar99,auVar99,3);
          auVar38 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar40 = vsubps_avx(auVar43,auVar99);
          auVar39 = vsubps_avx(auVar38,(undefined1  [16])0x0);
          auVar173._0_4_ = auVar40._0_4_ + auVar39._0_4_;
          auVar173._4_4_ = auVar40._4_4_ + auVar39._4_4_;
          auVar173._8_4_ = auVar40._8_4_ + auVar39._8_4_;
          auVar173._12_4_ = auVar40._12_4_ + auVar39._12_4_;
          auVar40 = vshufps_avx(auVar99,auVar99,0xb1);
          auVar39 = vshufps_avx(auVar155,auVar155,0xb1);
          auVar41 = vshufps_avx(auVar51,auVar51,0xb1);
          auVar42 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar224._4_4_ = auVar173._0_4_;
          auVar224._0_4_ = auVar173._0_4_;
          auVar224._8_4_ = auVar173._0_4_;
          auVar224._12_4_ = auVar173._0_4_;
          auVar45 = vshufps_avx(auVar173,auVar173,0x55);
          fVar187 = auVar45._0_4_;
          auVar183._0_4_ = auVar40._0_4_ * fVar187;
          fVar199 = auVar45._4_4_;
          auVar183._4_4_ = auVar40._4_4_ * fVar199;
          fVar201 = auVar45._8_4_;
          auVar183._8_4_ = auVar40._8_4_ * fVar201;
          fVar203 = auVar45._12_4_;
          auVar183._12_4_ = auVar40._12_4_ * fVar203;
          auVar190._0_4_ = auVar39._0_4_ * fVar187;
          auVar190._4_4_ = auVar39._4_4_ * fVar199;
          auVar190._8_4_ = auVar39._8_4_ * fVar201;
          auVar190._12_4_ = auVar39._12_4_ * fVar203;
          auVar209._0_4_ = auVar41._0_4_ * fVar187;
          auVar209._4_4_ = auVar41._4_4_ * fVar199;
          auVar209._8_4_ = auVar41._8_4_ * fVar201;
          auVar209._12_4_ = auVar41._12_4_ * fVar203;
          auVar174._0_4_ = auVar42._0_4_ * fVar187;
          auVar174._4_4_ = auVar42._4_4_ * fVar199;
          auVar174._8_4_ = auVar42._8_4_ * fVar201;
          auVar174._12_4_ = auVar42._12_4_ * fVar203;
          auVar40 = vfmadd231ps_fma(auVar183,auVar224,auVar99);
          auVar39 = vfmadd231ps_fma(auVar190,auVar224,auVar155);
          auVar50 = vfmadd231ps_fma(auVar209,auVar224,auVar51);
          auVar54 = vfmadd231ps_fma(auVar174,(undefined1  [16])0x0,auVar224);
          auVar45 = vshufpd_avx(auVar40,auVar40,1);
          auVar46 = vshufpd_avx(auVar39,auVar39,1);
          auVar48 = vshufpd_avx512vl(auVar50,auVar50,1);
          auVar49 = vshufpd_avx512vl(auVar54,auVar54,1);
          in_ZMM17 = ZEXT1664(auVar49);
          auVar41 = vminss_avx(auVar40,auVar39);
          auVar40 = vmaxss_avx(auVar39,auVar40);
          auVar42 = vminss_avx(auVar50,auVar54);
          auVar39 = vmaxss_avx(auVar54,auVar50);
          auVar41 = vminss_avx(auVar41,auVar42);
          auVar40 = vmaxss_avx(auVar39,auVar40);
          auVar42 = vminss_avx(auVar45,auVar46);
          auVar39 = vmaxss_avx(auVar46,auVar45);
          auVar45 = vminss_avx512f(auVar48,auVar49);
          auVar46 = vmaxss_avx512f(auVar49,auVar48);
          vmaxss_avx(auVar46,auVar39);
          auVar39 = vminss_avx512f(auVar42,auVar45);
          vucomiss_avx512f(auVar41);
          if ((bVar29 || bVar32) ||
             (auVar42 = vucomiss_avx512f(auVar36), bVar33 = bVar32, bVar29 || bVar32)) {
            auVar42 = vucomiss_avx512f(auVar36);
            auVar45 = vucomiss_avx512f(auVar39);
            auVar40 = vucomiss_avx512f(auVar36);
            bVar33 = bVar29 || bVar32;
            bVar30 = bVar29 || bVar32;
            if (!bVar29 && !bVar32) goto LAB_01aa7a1f;
            uVar10 = vcmpps_avx512vl(auVar41,auVar45,5);
            uVar11 = vcmpps_avx512vl(auVar39,auVar45,5);
            uVar25 = (uint)uVar10 & (uint)uVar11;
            bVar19 = (uVar25 & 1) == 0;
            bVar33 = (!bVar29 && !bVar32) && bVar19;
            bVar30 = (!bVar29 && !bVar32) && (uVar25 & 1) == 0;
            if ((!bVar29 && !bVar32) && bVar19) goto LAB_01aa7a1f;
          }
          else {
LAB_01aa7a1f:
            auVar46 = vxorps_avx512vl(auVar233._0_16_,auVar233._0_16_);
            auVar233 = ZEXT1664(auVar46);
            vcmpss_avx512f(auVar41,auVar46,1);
            uVar10 = vcmpss_avx512f(auVar40,auVar46,1);
            bVar32 = (bool)((byte)uVar10 & 1);
            auVar65._0_16_ = auVar239._0_16_;
            auVar76._4_28_ = auVar65._4_28_;
            auVar76._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * auVar239._0_4_);
            vucomiss_avx512f(auVar76._0_16_);
            bVar30 = (bool)(!bVar33 | bVar30);
            bVar33 = bVar30 == false;
            auVar78._16_16_ = auVar65._16_16_;
            auVar78._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar77._4_28_ = auVar78._4_28_;
            auVar77._0_4_ = (uint)bVar30 * auVar46._0_4_ + (uint)!bVar30 * 0x7f800000;
            auVar45 = auVar77._0_16_;
            auVar80._16_16_ = auVar65._16_16_;
            auVar80._0_16_ = SUB6416(ZEXT464(0xff800000),0);
            auVar79._4_28_ = auVar80._4_28_;
            auVar79._0_4_ = (uint)bVar30 * auVar46._0_4_ + (uint)!bVar30 * -0x800000;
            auVar36 = auVar79._0_16_;
            auVar47 = vxorps_avx512vl(auVar47,auVar47);
            uVar10 = vcmpss_avx512f(auVar39,auVar46,1);
            bVar32 = (bool)((byte)uVar10 & 1);
            auVar82._16_16_ = auVar65._16_16_;
            auVar82._0_16_ = auVar239._0_16_;
            auVar81._4_28_ = auVar82._4_28_;
            auVar81._0_4_ = (float)((uint)bVar32 * -0x40800000 + (uint)!bVar32 * auVar239._0_4_);
            vucomiss_avx512f(auVar81._0_16_);
            if ((bVar30) || (bVar33)) {
              auVar39 = vucomiss_avx512f(auVar41);
              if ((bVar30) || (bVar33)) {
                auVar18._8_4_ = 0x80000000;
                auVar18._0_8_ = 0x8000000080000000;
                auVar18._12_4_ = 0x80000000;
                auVar46 = vxorps_avx512vl(auVar41,auVar18);
                auVar39 = vsubss_avx512f(auVar39,auVar41);
                auVar39 = vdivss_avx512f(auVar46,auVar39);
                auVar41 = vsubss_avx512f(ZEXT416(0x3f800000),auVar39);
                auVar41 = vfmadd213ss_avx512f(auVar41,auVar47,auVar39);
                auVar39 = auVar41;
              }
              else {
                auVar41 = vxorps_avx512vl(auVar39,auVar39);
                vucomiss_avx512f(auVar41);
                if ((bVar30) || (auVar39 = ZEXT416(0x3f800000), bVar33)) {
                  auVar41 = ZEXT416(0x7f800000);
                  auVar39 = SUB6416(ZEXT464(0xff800000),0);
                }
              }
              auVar45 = vminss_avx512f(auVar45,auVar41);
              auVar36 = vmaxss_avx(auVar39,auVar36);
            }
            auVar239 = ZEXT464(0x3f800000);
            in_ZMM17 = ZEXT1664(local_298);
            uVar10 = vcmpss_avx512f(auVar42,auVar47,1);
            bVar30 = (bool)((byte)uVar10 & 1);
            auVar39 = auVar239._0_16_;
            fVar187 = (float)((uint)bVar30 * -0x40800000 + (uint)!bVar30 * 0x3f800000);
            if ((auVar76._0_4_ != fVar187) || (NAN(auVar76._0_4_) || NAN(fVar187))) {
              fVar201 = auVar42._0_4_;
              fVar199 = auVar40._0_4_;
              if ((fVar201 != fVar199) || (NAN(fVar201) || NAN(fVar199))) {
                auVar17._8_4_ = 0x80000000;
                auVar17._0_8_ = 0x8000000080000000;
                auVar17._12_4_ = 0x80000000;
                auVar40 = vxorps_avx512vl(auVar40,auVar17);
                auVar175._0_4_ = auVar40._0_4_ / (fVar201 - fVar199);
                auVar175._4_12_ = auVar40._4_12_;
                auVar40 = vsubss_avx512f(auVar39,auVar175);
                auVar40 = vfmadd213ss_avx512f(auVar40,auVar47,auVar175);
                auVar41 = auVar40;
              }
              else if ((fVar199 != 0.0) ||
                      (auVar40 = auVar39, auVar41 = ZEXT816(0) << 0x40, NAN(fVar199))) {
                auVar40 = SUB6416(ZEXT464(0xff800000),0);
                auVar41 = SUB6416(ZEXT464(0x7f800000),0);
              }
              auVar45 = vminss_avx(auVar45,auVar41);
              auVar36 = vmaxss_avx(auVar40,auVar36);
            }
            bVar30 = auVar81._0_4_ != fVar187;
            auVar40 = vminss_avx512f(auVar45,auVar39);
            auVar84._16_16_ = auVar65._16_16_;
            auVar84._0_16_ = auVar45;
            auVar83._4_28_ = auVar84._4_28_;
            auVar83._0_4_ = (uint)bVar30 * auVar40._0_4_ + (uint)!bVar30 * auVar45._0_4_;
            auVar40 = vmaxss_avx512f(auVar39,auVar36);
            auVar86._16_16_ = auVar65._16_16_;
            auVar86._0_16_ = auVar36;
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ = (uint)bVar30 * auVar40._0_4_ + (uint)!bVar30 * auVar36._0_4_;
            auVar36 = vmaxss_avx512f(auVar47,auVar83._0_16_);
            auVar40 = vminss_avx512f(auVar85._0_16_,auVar39);
            if (auVar36._0_4_ <= auVar40._0_4_) {
              auVar42 = vmaxss_avx512f(auVar47,ZEXT416((uint)(auVar36._0_4_ + -0.1)));
              auVar50 = vminss_avx512f(ZEXT416((uint)(auVar40._0_4_ + 0.1)),auVar39);
              auVar117._0_8_ = auVar99._0_8_;
              auVar117._8_8_ = auVar117._0_8_;
              auVar191._8_8_ = auVar155._0_8_;
              auVar191._0_8_ = auVar155._0_8_;
              auVar210._8_8_ = auVar51._0_8_;
              auVar210._0_8_ = auVar51._0_8_;
              auVar36 = vshufpd_avx(auVar155,auVar155,3);
              auVar40 = vshufpd_avx(auVar51,auVar51,3);
              auVar41 = vshufps_avx(auVar42,auVar50,0);
              auVar46 = vsubps_avx512vl(auVar37,auVar41);
              fVar187 = auVar41._0_4_;
              auVar149._0_4_ = fVar187 * auVar43._0_4_;
              fVar199 = auVar41._4_4_;
              auVar149._4_4_ = fVar199 * auVar43._4_4_;
              fVar201 = auVar41._8_4_;
              auVar149._8_4_ = fVar201 * auVar43._8_4_;
              fVar203 = auVar41._12_4_;
              auVar149._12_4_ = fVar203 * auVar43._12_4_;
              auVar156._0_4_ = fVar187 * auVar36._0_4_;
              auVar156._4_4_ = fVar199 * auVar36._4_4_;
              auVar156._8_4_ = fVar201 * auVar36._8_4_;
              auVar156._12_4_ = fVar203 * auVar36._12_4_;
              auVar228._0_4_ = auVar40._0_4_ * fVar187;
              auVar228._4_4_ = auVar40._4_4_ * fVar199;
              auVar228._8_4_ = auVar40._8_4_ * fVar201;
              auVar228._12_4_ = auVar40._12_4_ * fVar203;
              auVar135._0_4_ = fVar187 * auVar38._0_4_;
              auVar135._4_4_ = fVar199 * auVar38._4_4_;
              auVar135._8_4_ = fVar201 * auVar38._8_4_;
              auVar135._12_4_ = fVar203 * auVar38._12_4_;
              auVar43 = vfmadd231ps_fma(auVar149,auVar46,auVar117);
              auVar38 = vfmadd231ps_fma(auVar156,auVar46,auVar191);
              auVar45 = vfmadd231ps_fma(auVar228,auVar46,auVar210);
              auVar46 = vfmadd231ps_fma(auVar135,auVar46,ZEXT816(0));
              auVar40 = vsubss_avx512f(auVar39,auVar42);
              auVar36 = vmovshdup_avx(auVar105);
              auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar42._0_4_)),auVar105,
                                        auVar40);
              auVar40 = vsubss_avx512f(auVar39,auVar50);
              auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar36._0_4_ * auVar50._0_4_)),auVar105,
                                        auVar40);
              auVar51 = vdivss_avx512f(auVar39,ZEXT416((uint)fVar206));
              auVar36 = vsubps_avx(auVar38,auVar43);
              auVar41 = vmulps_avx512vl(auVar36,auVar44);
              auVar36 = vsubps_avx(auVar45,auVar38);
              auVar42 = vmulps_avx512vl(auVar36,auVar44);
              auVar36 = vsubps_avx(auVar46,auVar45);
              auVar36 = vmulps_avx512vl(auVar36,auVar44);
              auVar40 = vminps_avx(auVar42,auVar36);
              auVar36 = vmaxps_avx(auVar42,auVar36);
              auVar40 = vminps_avx(auVar41,auVar40);
              auVar36 = vmaxps_avx(auVar41,auVar36);
              auVar41 = vshufpd_avx(auVar40,auVar40,3);
              auVar42 = vshufpd_avx(auVar36,auVar36,3);
              auVar40 = vminps_avx(auVar40,auVar41);
              auVar36 = vmaxps_avx(auVar36,auVar42);
              fVar206 = auVar51._0_4_;
              auVar176._0_4_ = auVar40._0_4_ * fVar206;
              auVar176._4_4_ = auVar40._4_4_ * fVar206;
              auVar176._8_4_ = auVar40._8_4_ * fVar206;
              auVar176._12_4_ = auVar40._12_4_ * fVar206;
              auVar165._0_4_ = fVar206 * auVar36._0_4_;
              auVar165._4_4_ = fVar206 * auVar36._4_4_;
              auVar165._8_4_ = fVar206 * auVar36._8_4_;
              auVar165._12_4_ = fVar206 * auVar36._12_4_;
              auVar51 = vdivss_avx512f(auVar39,ZEXT416((uint)(auVar48._0_4_ - auVar99._0_4_)));
              auVar36 = vshufpd_avx(auVar43,auVar43,3);
              auVar40 = vshufpd_avx(auVar38,auVar38,3);
              auVar41 = vshufpd_avx(auVar45,auVar45,3);
              auVar42 = vshufpd_avx(auVar46,auVar46,3);
              auVar36 = vsubps_avx(auVar36,auVar43);
              auVar43 = vsubps_avx(auVar40,auVar38);
              auVar38 = vsubps_avx(auVar41,auVar45);
              auVar42 = vsubps_avx(auVar42,auVar46);
              auVar40 = vminps_avx(auVar36,auVar43);
              auVar36 = vmaxps_avx(auVar36,auVar43);
              auVar41 = vminps_avx(auVar38,auVar42);
              auVar41 = vminps_avx(auVar40,auVar41);
              auVar40 = vmaxps_avx(auVar38,auVar42);
              auVar36 = vmaxps_avx(auVar36,auVar40);
              fVar206 = auVar51._0_4_;
              auVar211._0_4_ = fVar206 * auVar41._0_4_;
              auVar211._4_4_ = fVar206 * auVar41._4_4_;
              auVar211._8_4_ = fVar206 * auVar41._8_4_;
              auVar211._12_4_ = fVar206 * auVar41._12_4_;
              auVar192._0_4_ = fVar206 * auVar36._0_4_;
              auVar192._4_4_ = fVar206 * auVar36._4_4_;
              auVar192._8_4_ = fVar206 * auVar36._8_4_;
              auVar192._12_4_ = fVar206 * auVar36._12_4_;
              auVar42 = vinsertps_avx(auVar35,auVar99,0x10);
              auVar49 = vpermt2ps_avx512vl(auVar35,_DAT_01feecd0,auVar48);
              auVar106._0_4_ = auVar42._0_4_ + auVar49._0_4_;
              auVar106._4_4_ = auVar42._4_4_ + auVar49._4_4_;
              auVar106._8_4_ = auVar42._8_4_ + auVar49._8_4_;
              auVar106._12_4_ = auVar42._12_4_ + auVar49._12_4_;
              auVar15._8_4_ = 0x3f000000;
              auVar15._0_8_ = 0x3f0000003f000000;
              auVar15._12_4_ = 0x3f000000;
              auVar51 = vmulps_avx512vl(auVar106,auVar15);
              auVar40 = vshufps_avx(auVar51,auVar51,0x54);
              uVar88 = auVar51._0_4_;
              auVar110._4_4_ = uVar88;
              auVar110._0_4_ = uVar88;
              auVar110._8_4_ = uVar88;
              auVar110._12_4_ = uVar88;
              auVar43 = vfmadd213ps_avx512vl(local_e8,auVar110,local_288);
              auVar38 = vfmadd213ps_avx512vl(local_f8,auVar110,local_298);
              auVar41 = vfmadd213ps_fma(local_108,auVar110,local_1a8);
              auVar36 = vsubps_avx(auVar38,auVar43);
              auVar43 = vfmadd213ps_fma(auVar36,auVar110,auVar43);
              auVar36 = vsubps_avx(auVar41,auVar38);
              auVar36 = vfmadd213ps_fma(auVar36,auVar110,auVar38);
              auVar36 = vsubps_avx(auVar36,auVar43);
              auVar41 = vfmadd231ps_fma(auVar43,auVar36,auVar110);
              auVar45 = vmulps_avx512vl(auVar36,auVar44);
              auVar220._8_8_ = auVar41._0_8_;
              auVar220._0_8_ = auVar41._0_8_;
              auVar36 = vshufpd_avx(auVar41,auVar41,3);
              auVar41 = vshufps_avx(auVar51,auVar51,0x55);
              auVar43 = vsubps_avx(auVar36,auVar220);
              auVar38 = vfmadd231ps_fma(auVar220,auVar41,auVar43);
              auVar229._8_8_ = auVar45._0_8_;
              auVar229._0_8_ = auVar45._0_8_;
              auVar36 = vshufpd_avx(auVar45,auVar45,3);
              auVar36 = vsubps_avx512vl(auVar36,auVar229);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar41,auVar229);
              auVar111._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
              auVar111._8_4_ = auVar43._8_4_ ^ 0x80000000;
              auVar111._12_4_ = auVar43._12_4_ ^ 0x80000000;
              auVar41 = vmovshdup_avx512vl(auVar36);
              auVar230._0_8_ = auVar41._0_8_ ^ 0x8000000080000000;
              auVar230._8_4_ = auVar41._8_4_ ^ 0x80000000;
              auVar230._12_4_ = auVar41._12_4_ ^ 0x80000000;
              auVar45 = vmovshdup_avx512vl(auVar43);
              auVar46 = vpermt2ps_avx512vl(auVar230,ZEXT416(5),auVar43);
              auVar233 = ZEXT464(0x40400000);
              auVar41 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar41._0_4_ * auVar43._0_4_)),auVar36,
                                            auVar45);
              auVar43 = vpermt2ps_avx512vl(auVar36,SUB6416(ZEXT464(4),0),auVar111);
              auVar136._0_4_ = auVar41._0_4_;
              auVar136._4_4_ = auVar136._0_4_;
              auVar136._8_4_ = auVar136._0_4_;
              auVar136._12_4_ = auVar136._0_4_;
              auVar36 = vdivps_avx(auVar46,auVar136);
              auVar52 = vdivps_avx512vl(auVar43,auVar136);
              fVar206 = auVar38._0_4_;
              auVar41 = vshufps_avx(auVar38,auVar38,0x55);
              auVar221._0_4_ = fVar206 * auVar36._0_4_ + auVar41._0_4_ * auVar52._0_4_;
              auVar221._4_4_ = fVar206 * auVar36._4_4_ + auVar41._4_4_ * auVar52._4_4_;
              auVar221._8_4_ = fVar206 * auVar36._8_4_ + auVar41._8_4_ * auVar52._8_4_;
              auVar221._12_4_ = fVar206 * auVar36._12_4_ + auVar41._12_4_ * auVar52._12_4_;
              auVar50 = vsubps_avx(auVar40,auVar221);
              auVar41 = vmovshdup_avx(auVar36);
              auVar40 = vinsertps_avx(auVar176,auVar211,0x1c);
              auVar231._0_4_ = auVar41._0_4_ * auVar40._0_4_;
              auVar231._4_4_ = auVar41._4_4_ * auVar40._4_4_;
              auVar231._8_4_ = auVar41._8_4_ * auVar40._8_4_;
              auVar231._12_4_ = auVar41._12_4_ * auVar40._12_4_;
              auVar54 = vinsertps_avx512f(auVar165,auVar192,0x1c);
              auVar41 = vmulps_avx512vl(auVar41,auVar54);
              auVar46 = vminps_avx512vl(auVar231,auVar41);
              auVar38 = vmaxps_avx(auVar41,auVar231);
              auVar45 = vmovshdup_avx(auVar52);
              auVar41 = vinsertps_avx(auVar211,auVar176,0x4c);
              auVar212._0_4_ = auVar45._0_4_ * auVar41._0_4_;
              auVar212._4_4_ = auVar45._4_4_ * auVar41._4_4_;
              auVar212._8_4_ = auVar45._8_4_ * auVar41._8_4_;
              auVar212._12_4_ = auVar45._12_4_ * auVar41._12_4_;
              auVar43 = vinsertps_avx(auVar192,auVar165,0x4c);
              auVar193._0_4_ = auVar45._0_4_ * auVar43._0_4_;
              auVar193._4_4_ = auVar45._4_4_ * auVar43._4_4_;
              auVar193._8_4_ = auVar45._8_4_ * auVar43._8_4_;
              auVar193._12_4_ = auVar45._12_4_ * auVar43._12_4_;
              auVar45 = vminps_avx(auVar212,auVar193);
              auVar46 = vaddps_avx512vl(auVar46,auVar45);
              auVar45 = vmaxps_avx(auVar193,auVar212);
              auVar194._0_4_ = auVar38._0_4_ + auVar45._0_4_;
              auVar194._4_4_ = auVar38._4_4_ + auVar45._4_4_;
              auVar194._8_4_ = auVar38._8_4_ + auVar45._8_4_;
              auVar194._12_4_ = auVar38._12_4_ + auVar45._12_4_;
              auVar213._8_8_ = 0x3f80000000000000;
              auVar213._0_8_ = 0x3f80000000000000;
              auVar38 = vsubps_avx(auVar213,auVar194);
              auVar45 = vsubps_avx(auVar213,auVar46);
              auVar46 = vsubps_avx(auVar42,auVar51);
              auVar51 = vsubps_avx(auVar49,auVar51);
              fVar203 = auVar46._0_4_;
              auVar232._0_4_ = fVar203 * auVar38._0_4_;
              fVar204 = auVar46._4_4_;
              auVar232._4_4_ = fVar204 * auVar38._4_4_;
              fVar205 = auVar46._8_4_;
              auVar232._8_4_ = fVar205 * auVar38._8_4_;
              fVar160 = auVar46._12_4_;
              auVar232._12_4_ = fVar160 * auVar38._12_4_;
              auVar53 = vbroadcastss_avx512vl(auVar36);
              auVar40 = vmulps_avx512vl(auVar53,auVar40);
              auVar54 = vmulps_avx512vl(auVar53,auVar54);
              auVar53 = vminps_avx512vl(auVar40,auVar54);
              auVar54 = vmaxps_avx512vl(auVar54,auVar40);
              auVar40 = vbroadcastss_avx512vl(auVar52);
              auVar41 = vmulps_avx512vl(auVar40,auVar41);
              auVar40 = vmulps_avx512vl(auVar40,auVar43);
              auVar43 = vminps_avx512vl(auVar41,auVar40);
              auVar43 = vaddps_avx512vl(auVar53,auVar43);
              auVar46 = vmulps_avx512vl(auVar46,auVar45);
              in_ZMM17 = ZEXT1664(auVar46);
              fVar206 = auVar51._0_4_;
              auVar195._0_4_ = fVar206 * auVar38._0_4_;
              fVar187 = auVar51._4_4_;
              auVar195._4_4_ = fVar187 * auVar38._4_4_;
              fVar199 = auVar51._8_4_;
              auVar195._8_4_ = fVar199 * auVar38._8_4_;
              fVar201 = auVar51._12_4_;
              auVar195._12_4_ = fVar201 * auVar38._12_4_;
              auVar214._0_4_ = fVar206 * auVar45._0_4_;
              auVar214._4_4_ = fVar187 * auVar45._4_4_;
              auVar214._8_4_ = fVar199 * auVar45._8_4_;
              auVar214._12_4_ = fVar201 * auVar45._12_4_;
              auVar40 = vmaxps_avx(auVar40,auVar41);
              auVar166._0_4_ = auVar54._0_4_ + auVar40._0_4_;
              auVar166._4_4_ = auVar54._4_4_ + auVar40._4_4_;
              auVar166._8_4_ = auVar54._8_4_ + auVar40._8_4_;
              auVar166._12_4_ = auVar54._12_4_ + auVar40._12_4_;
              auVar177._8_8_ = 0x3f800000;
              auVar177._0_8_ = 0x3f800000;
              auVar40 = vsubps_avx(auVar177,auVar166);
              auVar41 = vsubps_avx512vl(auVar177,auVar43);
              auVar225._0_4_ = fVar203 * auVar40._0_4_;
              auVar225._4_4_ = fVar204 * auVar40._4_4_;
              auVar225._8_4_ = fVar205 * auVar40._8_4_;
              auVar225._12_4_ = fVar160 * auVar40._12_4_;
              auVar222._0_4_ = fVar203 * auVar41._0_4_;
              auVar222._4_4_ = fVar204 * auVar41._4_4_;
              auVar222._8_4_ = fVar205 * auVar41._8_4_;
              auVar222._12_4_ = fVar160 * auVar41._12_4_;
              auVar167._0_4_ = fVar206 * auVar40._0_4_;
              auVar167._4_4_ = fVar187 * auVar40._4_4_;
              auVar167._8_4_ = fVar199 * auVar40._8_4_;
              auVar167._12_4_ = fVar201 * auVar40._12_4_;
              auVar178._0_4_ = fVar206 * auVar41._0_4_;
              auVar178._4_4_ = fVar187 * auVar41._4_4_;
              auVar178._8_4_ = fVar199 * auVar41._8_4_;
              auVar178._12_4_ = fVar201 * auVar41._12_4_;
              auVar40 = vminps_avx(auVar225,auVar222);
              auVar41 = vminps_avx512vl(auVar167,auVar178);
              auVar43 = vminps_avx512vl(auVar40,auVar41);
              auVar40 = vmaxps_avx(auVar222,auVar225);
              auVar41 = vmaxps_avx(auVar178,auVar167);
              auVar41 = vmaxps_avx(auVar41,auVar40);
              auVar38 = vminps_avx512vl(auVar232,auVar46);
              auVar40 = vminps_avx(auVar195,auVar214);
              auVar40 = vminps_avx(auVar38,auVar40);
              auVar40 = vhaddps_avx(auVar43,auVar40);
              auVar38 = vmaxps_avx512vl(auVar46,auVar232);
              auVar43 = vmaxps_avx(auVar214,auVar195);
              auVar43 = vmaxps_avx(auVar43,auVar38);
              auVar41 = vhaddps_avx(auVar41,auVar43);
              auVar40 = vshufps_avx(auVar40,auVar40,0xe8);
              auVar41 = vshufps_avx(auVar41,auVar41,0xe8);
              auVar168._0_4_ = auVar40._0_4_ + auVar50._0_4_;
              auVar168._4_4_ = auVar40._4_4_ + auVar50._4_4_;
              auVar168._8_4_ = auVar40._8_4_ + auVar50._8_4_;
              auVar168._12_4_ = auVar40._12_4_ + auVar50._12_4_;
              auVar179._0_4_ = auVar41._0_4_ + auVar50._0_4_;
              auVar179._4_4_ = auVar41._4_4_ + auVar50._4_4_;
              auVar179._8_4_ = auVar41._8_4_ + auVar50._8_4_;
              auVar179._12_4_ = auVar41._12_4_ + auVar50._12_4_;
              auVar40 = vmaxps_avx(auVar42,auVar168);
              auVar41 = vminps_avx(auVar179,auVar49);
              uVar28 = vcmpps_avx512vl(auVar41,auVar40,1);
              if ((uVar28 & 3) == 0) {
                uVar28 = vcmpps_avx512vl(auVar179,auVar49,1);
                uVar10 = vcmpps_avx512vl(auVar35,auVar168,1);
                if (((ushort)uVar10 & (ushort)uVar28 & 1) == 0) {
                  bVar20 = 0;
                }
                else {
                  auVar40 = vmovshdup_avx(auVar168);
                  bVar20 = auVar99._0_4_ < auVar40._0_4_ & (byte)(uVar28 >> 1) & 0x7f;
                }
                if (((!bVar29 || uVar5 != 0 && !bVar31) | bVar20) != 1) {
                  auVar105 = vinsertps_avx(auVar99,auVar48,0x10);
                  auVar240 = ZEXT1664(local_1b8);
                  goto LAB_01aa72c8;
                }
                lVar24 = 200;
                do {
                  auVar35 = vsubss_avx512f(auVar39,auVar50);
                  fVar199 = auVar35._0_4_;
                  fVar206 = fVar199 * fVar199 * fVar199;
                  auVar35 = vmulss_avx512f(auVar50,ZEXT416(0x40400000));
                  fVar187 = auVar35._0_4_ * fVar199 * fVar199;
                  fVar201 = auVar50._0_4_;
                  auVar35 = vmulss_avx512f(ZEXT416((uint)(fVar201 * fVar201)),ZEXT416(0x40400000));
                  fVar199 = fVar199 * auVar35._0_4_;
                  auVar125._4_4_ = fVar206;
                  auVar125._0_4_ = fVar206;
                  auVar125._8_4_ = fVar206;
                  auVar125._12_4_ = fVar206;
                  auVar118._4_4_ = fVar187;
                  auVar118._0_4_ = fVar187;
                  auVar118._8_4_ = fVar187;
                  auVar118._12_4_ = fVar187;
                  auVar93._4_4_ = fVar199;
                  auVar93._0_4_ = fVar199;
                  auVar93._8_4_ = fVar199;
                  auVar93._12_4_ = fVar199;
                  fVar201 = fVar201 * fVar201 * fVar201;
                  auVar150._0_4_ = (float)local_d8._0_4_ * fVar201;
                  auVar150._4_4_ = (float)local_d8._4_4_ * fVar201;
                  auVar150._8_4_ = fStack_d0 * fVar201;
                  auVar150._12_4_ = fStack_cc * fVar201;
                  auVar35 = vfmadd231ps_fma(auVar150,local_1a8,auVar93);
                  auVar35 = vfmadd231ps_fma(auVar35,local_298,auVar118);
                  auVar35 = vfmadd231ps_fma(auVar35,local_288,auVar125);
                  auVar94._8_8_ = auVar35._0_8_;
                  auVar94._0_8_ = auVar35._0_8_;
                  auVar35 = vshufpd_avx(auVar35,auVar35,3);
                  auVar40 = vshufps_avx(auVar50,auVar50,0x55);
                  auVar35 = vsubps_avx(auVar35,auVar94);
                  auVar40 = vfmadd213ps_fma(auVar35,auVar40,auVar94);
                  fVar206 = auVar40._0_4_;
                  auVar35 = vshufps_avx(auVar40,auVar40,0x55);
                  auVar95._0_4_ = auVar36._0_4_ * fVar206 + auVar52._0_4_ * auVar35._0_4_;
                  auVar95._4_4_ = auVar36._4_4_ * fVar206 + auVar52._4_4_ * auVar35._4_4_;
                  auVar95._8_4_ = auVar36._8_4_ * fVar206 + auVar52._8_4_ * auVar35._8_4_;
                  auVar95._12_4_ = auVar36._12_4_ * fVar206 + auVar52._12_4_ * auVar35._12_4_;
                  auVar50 = vsubps_avx(auVar50,auVar95);
                  auVar35 = vandps_avx512vl(auVar40,auVar237._0_16_);
                  auVar40 = vprolq_avx512vl(auVar35,0x20);
                  auVar35 = vmaxss_avx(auVar40,auVar35);
                  bVar31 = auVar35._0_4_ <= (float)local_c8._0_4_;
                  if (auVar35._0_4_ < (float)local_c8._0_4_) {
                    auVar35 = vucomiss_avx512f(auVar47);
                    if (bVar31) {
                      auVar36 = vucomiss_avx512f(auVar35);
                      auVar239 = ZEXT1664(auVar36);
                      if (bVar31) {
                        vmovshdup_avx(auVar35);
                        auVar36 = vucomiss_avx512f(auVar47);
                        if (bVar31) {
                          auVar47 = vucomiss_avx512f(auVar36);
                          auVar239 = ZEXT1664(auVar47);
                          if (bVar31) {
                            auVar40 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128
                                                                  [2]),
                                                    ZEXT416((uint)(pre->ray_space).vy.field_0.m128
                                                                  [2]),0x1c);
                            auVar46 = vinsertps_avx(auVar40,ZEXT416((uint)(pre->ray_space).vz.
                                                                          field_0.m128[2]),0x28);
                            aVar1 = (ray->super_RayK<1>).org.field_0;
                            auVar40 = vsubps_avx(local_1c8,(undefined1  [16])aVar1);
                            auVar40 = vdpps_avx(auVar40,auVar46,0x7f);
                            auVar39 = vsubps_avx(local_208,(undefined1  [16])aVar1);
                            auVar39 = vdpps_avx(auVar39,auVar46,0x7f);
                            auVar41 = vsubps_avx(local_218,(undefined1  [16])aVar1);
                            auVar41 = vdpps_avx(auVar41,auVar46,0x7f);
                            auVar42 = vsubps_avx(local_1e8,(undefined1  [16])aVar1);
                            auVar42 = vdpps_avx(auVar42,auVar46,0x7f);
                            auVar43 = vsubps_avx(_local_1d8,(undefined1  [16])aVar1);
                            auVar43 = vdpps_avx(auVar43,auVar46,0x7f);
                            auVar38 = vsubps_avx(_local_228,(undefined1  [16])aVar1);
                            auVar38 = vdpps_avx(auVar38,auVar46,0x7f);
                            auVar45 = vsubps_avx(_local_238,(undefined1  [16])aVar1);
                            auVar45 = vdpps_avx(auVar45,auVar46,0x7f);
                            auVar51 = vsubps_avx(_local_1f8,(undefined1  [16])aVar1);
                            auVar46 = vdpps_avx(auVar51,auVar46,0x7f);
                            auVar51 = vsubss_avx512f(auVar47,auVar36);
                            fVar206 = auVar36._0_4_;
                            auVar36 = vfmadd231ss_fma(ZEXT416((uint)(auVar43._0_4_ * fVar206)),
                                                      auVar51,auVar40);
                            auVar40 = vfmadd231ss_fma(ZEXT416((uint)(auVar38._0_4_ * fVar206)),
                                                      auVar51,auVar39);
                            auVar39 = vfmadd231ss_fma(ZEXT416((uint)(auVar45._0_4_ * fVar206)),
                                                      auVar51,auVar41);
                            auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar206 * auVar46._0_4_)),
                                                      auVar51,auVar42);
                            auVar47 = vsubss_avx512f(auVar47,auVar35);
                            auVar151._0_4_ = auVar47._0_4_;
                            fVar187 = auVar151._0_4_ * auVar151._0_4_ * auVar151._0_4_;
                            auVar47 = vmulss_avx512f(auVar35,ZEXT416(0x40400000));
                            fVar199 = auVar47._0_4_ * auVar151._0_4_ * auVar151._0_4_;
                            fVar206 = auVar35._0_4_;
                            auVar137._0_4_ = fVar206 * fVar206;
                            auVar137._4_4_ = auVar35._4_4_ * auVar35._4_4_;
                            auVar137._8_4_ = auVar35._8_4_ * auVar35._8_4_;
                            auVar137._12_4_ = auVar35._12_4_ * auVar35._12_4_;
                            auVar47 = vmulss_avx512f(auVar137,ZEXT416(0x40400000));
                            fVar201 = auVar151._0_4_ * auVar47._0_4_;
                            fVar204 = fVar206 * auVar137._0_4_;
                            auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar41._0_4_)),
                                                      ZEXT416((uint)fVar201),auVar39);
                            auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar199),auVar40);
                            auVar36 = vfmadd231ss_fma(auVar47,ZEXT416((uint)fVar187),auVar36);
                            fVar203 = auVar36._0_4_;
                            if (((ray->super_RayK<1>).org.field_0.m128[3] <= fVar203) &&
                               (local_324 = (ray->super_RayK<1>).tfar, fVar203 <= local_324)) {
                              auVar36 = vshufps_avx(auVar35,auVar35,0x55);
                              auVar40 = vsubps_avx512vl(auVar37,auVar36);
                              fVar205 = auVar36._0_4_;
                              auVar180._0_4_ = fVar205 * (float)local_1d8._0_4_;
                              fVar160 = auVar36._4_4_;
                              auVar180._4_4_ = fVar160 * (float)local_1d8._4_4_;
                              fVar87 = auVar36._8_4_;
                              auVar180._8_4_ = fVar87 * fStack_1d0;
                              fVar96 = auVar36._12_4_;
                              auVar180._12_4_ = fVar96 * fStack_1cc;
                              auVar184._0_4_ = fVar205 * (float)local_228._0_4_;
                              auVar184._4_4_ = fVar160 * (float)local_228._4_4_;
                              auVar184._8_4_ = fVar87 * fStack_220;
                              auVar184._12_4_ = fVar96 * fStack_21c;
                              auVar196._0_4_ = fVar205 * (float)local_238._0_4_;
                              auVar196._4_4_ = fVar160 * (float)local_238._4_4_;
                              auVar196._8_4_ = fVar87 * fStack_230;
                              auVar196._12_4_ = fVar96 * fStack_22c;
                              auVar157._0_4_ = fVar205 * (float)local_1f8._0_4_;
                              auVar157._4_4_ = fVar160 * (float)local_1f8._4_4_;
                              auVar157._8_4_ = fVar87 * fStack_1f0;
                              auVar157._12_4_ = fVar96 * fStack_1ec;
                              auVar36 = vfmadd231ps_fma(auVar180,auVar40,local_1c8);
                              auVar37 = vfmadd231ps_fma(auVar184,auVar40,local_208);
                              auVar47 = vfmadd231ps_fma(auVar196,auVar40,local_218);
                              auVar40 = vfmadd231ps_fma(auVar157,auVar40,local_1e8);
                              auVar36 = vsubps_avx(auVar37,auVar36);
                              auVar37 = vsubps_avx(auVar47,auVar37);
                              auVar47 = vsubps_avx(auVar40,auVar47);
                              auVar197._0_4_ = fVar206 * auVar37._0_4_;
                              auVar197._4_4_ = fVar206 * auVar37._4_4_;
                              auVar197._8_4_ = fVar206 * auVar37._8_4_;
                              auVar197._12_4_ = fVar206 * auVar37._12_4_;
                              auVar151._4_4_ = auVar151._0_4_;
                              auVar151._8_4_ = auVar151._0_4_;
                              auVar151._12_4_ = auVar151._0_4_;
                              auVar36 = vfmadd231ps_fma(auVar197,auVar151,auVar36);
                              auVar158._0_4_ = fVar206 * auVar47._0_4_;
                              auVar158._4_4_ = fVar206 * auVar47._4_4_;
                              auVar158._8_4_ = fVar206 * auVar47._8_4_;
                              auVar158._12_4_ = fVar206 * auVar47._12_4_;
                              auVar37 = vfmadd231ps_fma(auVar158,auVar151,auVar37);
                              auVar159._0_4_ = fVar206 * auVar37._0_4_;
                              auVar159._4_4_ = fVar206 * auVar37._4_4_;
                              auVar159._8_4_ = fVar206 * auVar37._8_4_;
                              auVar159._12_4_ = fVar206 * auVar37._12_4_;
                              auVar36 = vfmadd231ps_fma(auVar159,auVar151,auVar36);
                              auVar36 = vmulps_avx512vl(auVar36,auVar44);
                              pGVar6 = (context->scene->geometries).items[uVar27].ptr;
                              if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                                auVar138._0_4_ = fVar204 * (float)local_148._0_4_;
                                auVar138._4_4_ = fVar204 * (float)local_148._4_4_;
                                auVar138._8_4_ = fVar204 * fStack_140;
                                auVar138._12_4_ = fVar204 * fStack_13c;
                                auVar126._4_4_ = fVar201;
                                auVar126._0_4_ = fVar201;
                                auVar126._8_4_ = fVar201;
                                auVar126._12_4_ = fVar201;
                                auVar37 = vfmadd132ps_fma(auVar126,auVar138,local_138);
                                auVar119._4_4_ = fVar199;
                                auVar119._0_4_ = fVar199;
                                auVar119._8_4_ = fVar199;
                                auVar119._12_4_ = fVar199;
                                auVar37 = vfmadd132ps_fma(auVar119,auVar37,local_128);
                                auVar112._4_4_ = fVar187;
                                auVar112._0_4_ = fVar187;
                                auVar112._8_4_ = fVar187;
                                auVar112._12_4_ = fVar187;
                                auVar44 = vfmadd132ps_fma(auVar112,auVar37,local_118);
                                auVar37 = vshufps_avx(auVar44,auVar44,0xc9);
                                auVar47 = vshufps_avx(auVar36,auVar36,0xc9);
                                auVar113._0_4_ = auVar44._0_4_ * auVar47._0_4_;
                                auVar113._4_4_ = auVar44._4_4_ * auVar47._4_4_;
                                auVar113._8_4_ = auVar44._8_4_ * auVar47._8_4_;
                                auVar113._12_4_ = auVar44._12_4_ * auVar47._12_4_;
                                auVar36 = vfmsub231ps_fma(auVar113,auVar36,auVar37);
                                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                                   (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                                  (ray->super_RayK<1>).tfar = fVar203;
                                  auVar37 = vshufps_avx(auVar36,auVar36,0xe9);
                                  uVar10 = vmovlps_avx(auVar37);
                                  *(undefined8 *)&(ray->Ng).field_0 = uVar10;
                                  (ray->Ng).field_0.field_0.z = auVar36._0_4_;
                                  uVar10 = vmovlps_avx(auVar35);
                                  ray->u = (float)(int)uVar10;
                                  ray->v = (float)(int)((ulong)uVar10 >> 0x20);
                                  ray->primID = (uint)local_310;
                                  ray->geomID = uVar27;
                                  ray->instID[0] = context->user->instID[0];
                                  ray->instPrimID[0] = context->user->instPrimID[0];
                                }
                                else {
                                  auVar37 = vshufps_avx(auVar36,auVar36,0xe9);
                                  local_188 = vmovlps_avx(auVar37);
                                  local_180 = auVar36._0_4_;
                                  local_17c = vmovlps_avx(auVar35);
                                  local_174 = (uint)local_310;
                                  local_170 = uVar27;
                                  local_16c = context->user->instID[0];
                                  local_168 = context->user->instPrimID[0];
                                  (ray->super_RayK<1>).tfar = fVar203;
                                  local_328 = -1;
                                  local_268.valid = &local_328;
                                  local_268.geometryUserPtr = pGVar6->userPtr;
                                  local_268.context = context->user;
                                  local_268.ray = (RTCRayN *)ray;
                                  local_268.hit = (RTCHitN *)&local_188;
                                  local_268.N = 1;
                                  if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01aa8534:
                                    p_Var9 = context->args->filter;
                                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var9)(&local_268);
                                      auVar239 = ZEXT464(0x3f800000);
                                      auVar236 = ZEXT3264(_DAT_01feed20);
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                      auVar235 = ZEXT1664(auVar35);
                                      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar234 = ZEXT3264(auVar72);
                                      auVar65._16_16_ = auVar72._16_16_;
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                      auVar241 = ZEXT1664(auVar35);
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                      auVar238 = ZEXT1664(auVar35);
                                      auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                      auVar237 = ZEXT1664(auVar35);
                                      if (*local_268.valid == 0) goto LAB_01aa8658;
                                    }
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).components[0]
                                         = *(float *)local_268.hit;
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).field_0.y =
                                         *(float *)(local_268.hit + 4);
                                    (((Vec3f *)((long)local_268.ray + 0x30))->field_0).field_0.z =
                                         *(float *)(local_268.hit + 8);
                                    *(float *)((long)local_268.ray + 0x3c) =
                                         *(float *)(local_268.hit + 0xc);
                                    *(float *)((long)local_268.ray + 0x40) =
                                         *(float *)(local_268.hit + 0x10);
                                    *(float *)((long)local_268.ray + 0x44) =
                                         *(float *)(local_268.hit + 0x14);
                                    *(float *)((long)local_268.ray + 0x48) =
                                         *(float *)(local_268.hit + 0x18);
                                    *(float *)((long)local_268.ray + 0x4c) =
                                         *(float *)(local_268.hit + 0x1c);
                                    *(float *)((long)local_268.ray + 0x50) =
                                         *(float *)(local_268.hit + 0x20);
                                  }
                                  else {
                                    local_270 = context;
                                    (*pGVar6->intersectionFilterN)(&local_268);
                                    auVar239 = ZEXT464(0x3f800000);
                                    auVar236 = ZEXT3264(_DAT_01feed20);
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                                    auVar235 = ZEXT1664(auVar35);
                                    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar234 = ZEXT3264(auVar72);
                                    auVar65._16_16_ = auVar72._16_16_;
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                    auVar241 = ZEXT1664(auVar35);
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                    auVar238 = ZEXT1664(auVar35);
                                    auVar35 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                    auVar237 = ZEXT1664(auVar35);
                                    context = local_270;
                                    if (*local_268.valid != 0) goto LAB_01aa8534;
LAB_01aa8658:
                                    auVar239 = ZEXT464(0x3f800000);
                                    (ray->super_RayK<1>).tfar = local_324;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar24 = lVar24 + -1;
                } while (lVar24 != 0);
              }
            }
          }
          auVar72._16_16_ = auVar65._16_16_;
          auVar72._0_16_ = local_1b8;
          auVar240 = ZEXT1664(local_1b8);
          if (uVar21 == 0) break;
        } while( true );
      }
      fVar206 = (ray->super_RayK<1>).tfar;
      auVar16._4_4_ = fVar206;
      auVar16._0_4_ = fVar206;
      auVar16._8_4_ = fVar206;
      auVar16._12_4_ = fVar206;
      uVar10 = vcmpps_avx512vl(local_158,auVar16,2);
      uVar27 = (uint)uVar34 & (uint)local_320 & (uint)uVar10;
      uVar34 = (ulong)uVar27;
      prim = local_318;
    } while (uVar27 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_hn(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; Vec3fa n0,dn0,n1,dn1; geom->gather_hermite(p0,t0,n0,dn0,p1,t1,n1,dn1,geom->curve(primID));
          Intersector().intersect(pre,ray,context,geom,primID,p0,t0,p1,t1,n0,dn0,n1,dn1,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }